

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  __m256i c;
  __m256i c_00;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [24];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  undefined1 auVar37 [24];
  undefined1 auVar38 [24];
  undefined1 auVar39 [24];
  undefined1 auVar40 [24];
  undefined1 auVar41 [24];
  undefined1 auVar42 [24];
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar48 [64];
  int in_stack_00000008;
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *l;
  int8_t *s;
  int8_t *m;
  int8_t *t;
  __m256i cond_max;
  __m256i vFtL;
  __m256i vFtS;
  __m256i vFtM;
  __m256i vFt;
  __m256i vGapperL_1;
  __m256i vGapper_1;
  __m256i case2;
  __m256i case1;
  __m256i vWS;
  __m256i *pvWS;
  __m256i vWM;
  __m256i *pvWM;
  __m256i vW;
  __m256i *pvW;
  __m256i vHpL;
  __m256i vHpS;
  __m256i vHpM;
  __m256i vHp;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHtL;
  __m256i vHtS;
  __m256i vHtM;
  __m256i vHt;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_8_t h;
  int32_t segNum;
  int32_t index;
  __m256i vGapperL;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLen;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vPosMask;
  __m256i vMaxL;
  __m256i vMaxS;
  __m256i vMaxM;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int8_t length;
  int8_t similar;
  int8_t matches;
  int8_t score;
  __m256i vOne;
  __m256i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int8_t *boundary;
  __m256i *pvGapperL;
  __m256i *pvGapper;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvHL;
  __m256i *pvHS;
  __m256i *pvHM;
  __m256i *pvH;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvPs;
  __m256i *pvPm;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  size_t in_stack_ffffffffffffd3d0;
  undefined4 in_stack_ffffffffffffd3d8;
  undefined4 in_stack_ffffffffffffd3dc;
  undefined8 in_stack_ffffffffffffd3e0;
  undefined4 in_stack_ffffffffffffd3e8;
  int iVar49;
  undefined2 in_stack_ffffffffffffd3ec;
  undefined1 uVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  __m256i *local_2c00;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [64];
  __m256i *local_2b60;
  __m256i *local_2b58;
  __m256i *local_2b50;
  __m256i *local_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  __m256i local_2960;
  __m256i local_2940;
  __m256i local_2920;
  __m256i local_2900;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  longlong local_2720;
  longlong lStack_2718;
  longlong lStack_2710;
  longlong lStack_2708;
  longlong local_2700;
  longlong lStack_26f8;
  longlong lStack_26f0;
  longlong lStack_26e8;
  longlong local_26e0;
  longlong lStack_26d8;
  longlong lStack_26d0;
  longlong lStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  longlong local_2680;
  longlong lStack_2678;
  longlong lStack_2670;
  longlong lStack_2668;
  longlong local_2640;
  longlong lStack_2638;
  longlong lStack_2630;
  longlong lStack_2628;
  int local_2608;
  int local_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  parasail_result_t *local_25a8;
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  ulong local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  char local_2404;
  char local_2403;
  char local_2402;
  byte local_2401;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  byte local_23a2;
  byte local_23a1;
  undefined1 local_23a0 [16];
  undefined1 auStack_2390 [16];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  int8_t *local_2358;
  __m256i *local_2350;
  __m256i *local_2348;
  __m256i *local_2340;
  __m256i *local_2338;
  __m256i *local_2330;
  __m256i *local_2328;
  __m256i *local_2320;
  __m256i *local_2318;
  __m256i *local_2310;
  __m256i *local_2308;
  __m256i *local_2300;
  __m256i *local_22f8;
  __m256i *local_22f0;
  __m256i *local_22e8;
  long local_22e0;
  long local_22d8;
  long local_22d0;
  uint local_22c8;
  int local_22c4;
  uint local_22c0;
  int local_22bc;
  long local_22b8;
  int local_22b0;
  int local_22ac;
  int local_22a8;
  int local_22a4;
  int local_22a0;
  uint local_229c;
  int local_2298;
  uint local_2294;
  uint local_2290;
  int local_228c;
  long local_2288;
  parasail_result_t *local_2278;
  byte local_226c;
  byte local_226b;
  byte local_226a;
  byte local_2269;
  byte local_2268;
  byte local_2267;
  byte local_2266;
  byte local_2265;
  byte local_2264;
  undefined1 local_2263;
  byte local_2262;
  byte local_2261;
  undefined1 local_2260 [32];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  longlong local_2220;
  longlong lStack_2218;
  longlong lStack_2210;
  longlong lStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  longlong lStack_21e8;
  longlong local_21e0;
  longlong lStack_21d8;
  longlong lStack_21d0;
  longlong lStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined1 local_20c0 [16];
  undefined1 auStack_20b0 [16];
  byte local_20a0;
  byte local_209f;
  byte local_209e;
  byte local_209d;
  byte local_209c;
  byte local_209b;
  byte local_209a;
  byte local_2099;
  byte local_2098;
  byte local_2097;
  byte local_2096;
  byte local_2095;
  byte local_2094;
  byte local_2093;
  byte local_2092;
  byte local_2091;
  byte local_2090;
  byte local_208f;
  byte local_208e;
  byte local_208d;
  byte local_208c;
  byte local_208b;
  byte local_208a;
  byte local_2089;
  byte local_2088;
  byte local_2087;
  byte local_2086;
  byte local_2085;
  byte local_2084;
  byte local_2083;
  byte local_2082;
  byte local_2081;
  undefined1 local_2080 [32];
  byte local_2060;
  byte local_205f;
  byte local_205e;
  byte local_205d;
  byte local_205c;
  byte local_205b;
  byte local_205a;
  byte local_2059;
  byte local_2058;
  byte local_2057;
  byte local_2056;
  byte local_2055;
  byte local_2054;
  byte local_2053;
  byte local_2052;
  byte local_2051;
  byte local_2050;
  byte local_204f;
  byte local_204e;
  byte local_204d;
  byte local_204c;
  byte local_204b;
  byte local_204a;
  byte local_2049;
  byte local_2048;
  byte local_2047;
  byte local_2046;
  byte local_2045;
  byte local_2044;
  byte local_2043;
  byte local_2042;
  byte local_2041;
  undefined1 local_2040 [16];
  undefined1 auStack_2030 [16];
  undefined1 local_2020;
  undefined1 local_201f;
  undefined1 local_201e;
  undefined1 local_201d;
  undefined1 local_201c;
  undefined1 local_201b;
  undefined1 local_201a;
  undefined1 local_2019;
  undefined1 local_2018;
  undefined1 local_2017;
  undefined1 local_2016;
  undefined1 local_2015;
  undefined1 local_2014;
  undefined1 local_2013;
  undefined1 local_2012;
  undefined1 local_2011;
  undefined1 local_2010;
  undefined1 local_200f;
  undefined1 local_200e;
  undefined1 local_200d;
  undefined1 local_200c;
  undefined1 local_200b;
  undefined1 local_200a;
  undefined1 local_2009;
  undefined1 local_2008;
  undefined1 local_2007;
  undefined1 local_2006;
  undefined1 local_2005;
  undefined1 local_2004;
  undefined1 local_2003;
  undefined1 local_2002;
  undefined1 local_2001;
  undefined1 local_2000 [16];
  undefined1 auStack_1ff0 [16];
  byte local_1fe0;
  byte local_1fdf;
  byte local_1fde;
  byte local_1fdd;
  byte local_1fdc;
  byte local_1fdb;
  byte local_1fda;
  byte local_1fd9;
  byte local_1fd8;
  byte local_1fd7;
  byte local_1fd6;
  byte local_1fd5;
  byte local_1fd4;
  byte local_1fd3;
  byte local_1fd2;
  byte local_1fd1;
  byte local_1fd0;
  byte local_1fcf;
  byte local_1fce;
  byte local_1fcd;
  byte local_1fcc;
  byte local_1fcb;
  byte local_1fca;
  byte local_1fc9;
  byte local_1fc8;
  byte local_1fc7;
  byte local_1fc6;
  byte local_1fc5;
  byte local_1fc4;
  byte local_1fc3;
  byte local_1fc2;
  byte local_1fc1;
  undefined1 local_1fc0 [16];
  undefined1 auStack_1fb0 [16];
  byte local_1fa0;
  byte local_1f9f;
  byte local_1f9e;
  byte local_1f9d;
  byte local_1f9c;
  byte local_1f9b;
  byte local_1f9a;
  byte local_1f99;
  byte local_1f98;
  byte local_1f97;
  byte local_1f96;
  byte local_1f95;
  byte local_1f94;
  byte local_1f93;
  byte local_1f92;
  byte local_1f91;
  byte local_1f90;
  byte local_1f8f;
  byte local_1f8e;
  byte local_1f8d;
  byte local_1f8c;
  byte local_1f8b;
  byte local_1f8a;
  byte local_1f89;
  byte local_1f88;
  byte local_1f87;
  byte local_1f86;
  byte local_1f85;
  byte local_1f84;
  byte local_1f83;
  byte local_1f82;
  byte local_1f81;
  undefined1 local_1f80 [16];
  undefined1 auStack_1f70 [16];
  byte local_1f60;
  byte local_1f5f;
  byte local_1f5e;
  byte local_1f5d;
  byte local_1f5c;
  byte local_1f5b;
  byte local_1f5a;
  byte local_1f59;
  byte local_1f58;
  byte local_1f57;
  byte local_1f56;
  byte local_1f55;
  byte local_1f54;
  byte local_1f53;
  byte local_1f52;
  byte local_1f51;
  byte local_1f50;
  byte local_1f4f;
  byte local_1f4e;
  byte local_1f4d;
  byte local_1f4c;
  byte local_1f4b;
  byte local_1f4a;
  byte local_1f49;
  byte local_1f48;
  byte local_1f47;
  byte local_1f46;
  byte local_1f45;
  byte local_1f44;
  byte local_1f43;
  byte local_1f42;
  byte local_1f41;
  undefined1 local_1f40 [16];
  undefined1 auStack_1f30 [16];
  byte local_1f20;
  byte local_1f1f;
  byte local_1f1e;
  byte local_1f1d;
  byte local_1f1c;
  byte local_1f1b;
  byte local_1f1a;
  byte local_1f19;
  byte local_1f18;
  byte local_1f17;
  byte local_1f16;
  byte local_1f15;
  byte local_1f14;
  byte local_1f13;
  byte local_1f12;
  byte local_1f11;
  byte local_1f10;
  byte local_1f0f;
  byte local_1f0e;
  byte local_1f0d;
  byte local_1f0c;
  byte local_1f0b;
  byte local_1f0a;
  byte local_1f09;
  byte local_1f08;
  byte local_1f07;
  byte local_1f06;
  byte local_1f05;
  byte local_1f04;
  byte local_1f03;
  byte local_1f02;
  byte local_1f01;
  undefined1 local_1f00 [16];
  undefined1 auStack_1ef0 [16];
  byte local_1ee0;
  byte local_1edf;
  byte local_1ede;
  byte local_1edd;
  byte local_1edc;
  byte local_1edb;
  byte local_1eda;
  byte local_1ed9;
  byte local_1ed8;
  byte local_1ed7;
  byte local_1ed6;
  byte local_1ed5;
  byte local_1ed4;
  byte local_1ed3;
  byte local_1ed2;
  byte local_1ed1;
  byte local_1ed0;
  byte local_1ecf;
  byte local_1ece;
  byte local_1ecd;
  byte local_1ecc;
  byte local_1ecb;
  byte local_1eca;
  byte local_1ec9;
  byte local_1ec8;
  byte local_1ec7;
  byte local_1ec6;
  byte local_1ec5;
  byte local_1ec4;
  byte local_1ec3;
  byte local_1ec2;
  byte local_1ec1;
  undefined1 local_1ec0 [16];
  undefined1 local_1eb0 [16];
  byte local_1ea0;
  byte local_1e9f;
  byte local_1e9e;
  byte local_1e9d;
  byte local_1e9c;
  byte local_1e9b;
  byte local_1e9a;
  byte local_1e99;
  byte local_1e98;
  byte local_1e97;
  byte local_1e96;
  byte local_1e95;
  byte local_1e94;
  byte local_1e93;
  byte local_1e92;
  byte local_1e91;
  byte local_1e90;
  byte local_1e8f;
  byte local_1e8e;
  byte local_1e8d;
  byte local_1e8c;
  byte local_1e8b;
  byte local_1e8a;
  byte local_1e89;
  byte local_1e88;
  byte local_1e87;
  byte local_1e86;
  byte local_1e85;
  byte local_1e84;
  byte local_1e83;
  byte local_1e82;
  byte local_1e81;
  undefined1 local_1e80 [16];
  undefined1 auStack_1e70 [16];
  byte local_1e60;
  byte local_1e5f;
  byte local_1e5e;
  byte local_1e5d;
  byte local_1e5c;
  byte local_1e5b;
  byte local_1e5a;
  byte local_1e59;
  byte local_1e58;
  byte local_1e57;
  byte local_1e56;
  byte local_1e55;
  byte local_1e54;
  byte local_1e53;
  byte local_1e52;
  byte local_1e51;
  byte local_1e50;
  byte local_1e4f;
  byte local_1e4e;
  byte local_1e4d;
  byte local_1e4c;
  byte local_1e4b;
  byte local_1e4a;
  byte local_1e49;
  byte local_1e48;
  byte local_1e47;
  byte local_1e46;
  byte local_1e45;
  byte local_1e44;
  byte local_1e43;
  byte local_1e42;
  byte local_1e41;
  undefined1 local_1e40 [16];
  undefined1 auStack_1e30 [16];
  byte local_1e20;
  byte local_1e1f;
  byte local_1e1e;
  byte local_1e1d;
  byte local_1e1c;
  byte local_1e1b;
  byte local_1e1a;
  byte local_1e19;
  byte local_1e18;
  byte local_1e17;
  byte local_1e16;
  byte local_1e15;
  byte local_1e14;
  byte local_1e13;
  byte local_1e12;
  byte local_1e11;
  byte local_1e10;
  byte local_1e0f;
  byte local_1e0e;
  byte local_1e0d;
  byte local_1e0c;
  byte local_1e0b;
  byte local_1e0a;
  byte local_1e09;
  byte local_1e08;
  byte local_1e07;
  byte local_1e06;
  byte local_1e05;
  byte local_1e04;
  byte local_1e03;
  byte local_1e02;
  byte local_1e01;
  undefined1 local_1e00 [16];
  undefined1 local_1df0 [16];
  byte local_1de0;
  byte local_1ddf;
  byte local_1dde;
  byte local_1ddd;
  byte local_1ddc;
  byte local_1ddb;
  byte local_1dda;
  byte local_1dd9;
  byte local_1dd8;
  byte local_1dd7;
  byte local_1dd6;
  byte local_1dd5;
  byte local_1dd4;
  byte local_1dd3;
  byte local_1dd2;
  byte local_1dd1;
  byte local_1dd0;
  byte local_1dcf;
  byte local_1dce;
  byte local_1dcd;
  byte local_1dcc;
  byte local_1dcb;
  byte local_1dca;
  byte local_1dc9;
  byte local_1dc8;
  byte local_1dc7;
  byte local_1dc6;
  byte local_1dc5;
  byte local_1dc4;
  byte local_1dc3;
  byte local_1dc2;
  byte local_1dc1;
  undefined1 local_1dc0 [16];
  undefined1 auStack_1db0 [16];
  undefined1 local_1da0;
  undefined1 local_1d9f;
  undefined1 local_1d9e;
  undefined1 local_1d9d;
  undefined1 local_1d9c;
  undefined1 local_1d9b;
  undefined1 local_1d9a;
  undefined1 local_1d99;
  undefined1 local_1d98;
  undefined1 local_1d97;
  undefined1 local_1d96;
  undefined1 local_1d95;
  undefined1 local_1d94;
  undefined1 local_1d93;
  undefined1 local_1d92;
  undefined1 local_1d91;
  undefined1 local_1d90;
  undefined1 local_1d8f;
  undefined1 local_1d8e;
  undefined1 local_1d8d;
  undefined1 local_1d8c;
  undefined1 local_1d8b;
  undefined1 local_1d8a;
  undefined1 local_1d89;
  undefined1 local_1d88;
  undefined1 local_1d87;
  undefined1 local_1d86;
  undefined1 local_1d85;
  undefined1 local_1d84;
  undefined1 local_1d83;
  undefined1 local_1d82;
  undefined1 local_1d81;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  ulong local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  longlong local_1c80;
  longlong lStack_1c78;
  longlong lStack_1c70;
  longlong lStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  longlong lStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  longlong local_1be0;
  longlong lStack_1bd8;
  longlong lStack_1bd0;
  longlong lStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  longlong local_1ba0;
  longlong lStack_1b98;
  longlong lStack_1b90;
  longlong lStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  longlong local_1b60;
  longlong lStack_1b58;
  longlong lStack_1b50;
  longlong lStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  longlong local_1b20;
  longlong lStack_1b18;
  longlong lStack_1b10;
  longlong lStack_1b08;
  longlong local_1b00;
  longlong lStack_1af8;
  longlong lStack_1af0;
  longlong lStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  longlong lStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  longlong local_1a20;
  longlong lStack_1a18;
  longlong lStack_1a10;
  longlong lStack_1a08;
  undefined1 local_1a00 [32];
  ulong local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined1 local_19c0 [16];
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined1 local_1940 [16];
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  longlong lStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  longlong lStack_18c8;
  longlong local_18c0;
  longlong lStack_18b8;
  longlong lStack_18b0;
  longlong lStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 local_1880 [16];
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  longlong local_1860;
  longlong lStack_1858;
  longlong lStack_1850;
  longlong lStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  longlong local_1800;
  longlong lStack_17f8;
  longlong lStack_17f0;
  longlong lStack_17e8;
  __m256i *local_17c8;
  longlong local_17c0;
  longlong lStack_17b8;
  longlong lStack_17b0;
  longlong lStack_17a8;
  __m256i *local_1788;
  longlong local_1780;
  longlong lStack_1778;
  longlong lStack_1770;
  longlong lStack_1768;
  __m256i *local_1748;
  longlong local_1740;
  longlong lStack_1738;
  longlong lStack_1730;
  longlong lStack_1728;
  __m256i *local_1708;
  longlong local_1700;
  longlong lStack_16f8;
  longlong lStack_16f0;
  longlong lStack_16e8;
  __m256i *local_16c8;
  longlong local_16c0;
  longlong lStack_16b8;
  longlong lStack_16b0;
  longlong lStack_16a8;
  __m256i *local_1688;
  longlong local_1680;
  longlong lStack_1678;
  longlong lStack_1670;
  longlong lStack_1668;
  __m256i *local_1648;
  longlong local_1640;
  longlong lStack_1638;
  longlong lStack_1630;
  longlong lStack_1628;
  __m256i *local_1608;
  longlong local_1600;
  longlong lStack_15f8;
  longlong lStack_15f0;
  longlong lStack_15e8;
  __m256i *local_15c8;
  longlong local_15c0;
  longlong lStack_15b8;
  longlong lStack_15b0;
  longlong lStack_15a8;
  __m256i *local_1588;
  longlong local_1580;
  longlong lStack_1578;
  longlong lStack_1570;
  longlong lStack_1568;
  __m256i *local_1548;
  longlong local_1540;
  longlong lStack_1538;
  longlong lStack_1530;
  longlong lStack_1528;
  __m256i *local_1508;
  __m256i *local_14c8;
  longlong local_14c0;
  longlong lStack_14b8;
  longlong lStack_14b0;
  longlong lStack_14a8;
  __m256i *local_1488;
  longlong local_1480;
  longlong lStack_1478;
  longlong lStack_1470;
  longlong lStack_1468;
  __m256i *local_1460;
  __m256i *local_1458;
  __m256i *local_1450;
  __m256i *local_1448;
  __m256i *local_1440;
  __m256i *local_1438;
  __m256i *local_1430;
  __m256i *local_1428;
  __m256i *local_1420;
  __m256i *local_1418;
  __m256i *local_1410;
  __m256i *local_1408;
  __m256i *local_1400;
  __m256i *local_13f8;
  __m256i *local_13f0;
  __m256i *local_13e8;
  __m256i *local_13e0;
  __m256i *local_13d8;
  __m256i *local_13d0;
  __m256i *local_13c8;
  __m256i *local_13c0;
  undefined1 (*local_13b8) [32];
  undefined1 (*local_13b0) [32];
  undefined1 (*local_13a8) [32];
  __m256i *local_13a0;
  __m256i *local_1398;
  __m256i *local_1390;
  __m256i *local_1388;
  __m256i *local_1380;
  __m256i *local_1378;
  __m256i *local_1370;
  __m256i *local_1368;
  __m256i *local_1360;
  __m256i *local_1358;
  __m256i *local_1350;
  __m256i *local_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  longlong lStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  longlong local_1180;
  longlong lStack_1178;
  longlong lStack_1170;
  longlong lStack_1168;
  longlong local_1160;
  longlong lStack_1158;
  longlong lStack_1150;
  longlong lStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  longlong lStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  longlong local_1080;
  longlong lStack_1078;
  longlong lStack_1070;
  longlong lStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  longlong local_1040;
  longlong lStack_1038;
  longlong lStack_1030;
  longlong lStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  longlong local_1000;
  longlong lStack_ff8;
  longlong lStack_ff0;
  longlong lStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  longlong local_fc0;
  longlong lStack_fb8;
  longlong lStack_fb0;
  longlong lStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  longlong lStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  longlong lStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  longlong local_e00;
  longlong lStack_df8;
  longlong lStack_df0;
  longlong lStack_de8;
  longlong local_de0;
  longlong lStack_dd8;
  longlong lStack_dd0;
  longlong lStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  longlong lStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  longlong lStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  longlong lStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  longlong lStack_be8;
  undefined1 local_be0 [32];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  longlong lStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  longlong lStack_b28;
  undefined1 local_b20 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  longlong lStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  longlong lStack_a68;
  undefined1 local_a60 [32];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  longlong lStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  longlong local_540;
  longlong lStack_538;
  longlong lStack_530;
  longlong lStack_528;
  longlong local_520;
  longlong lStack_518;
  longlong lStack_510;
  longlong lStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong lStack_4d0;
  longlong lStack_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong lStack_4b0;
  longlong lStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  longlong local_480;
  longlong lStack_478;
  longlong lStack_470;
  longlong lStack_468;
  longlong local_460;
  longlong lStack_458;
  longlong lStack_450;
  longlong lStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  longlong lStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  longlong lStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  longlong lStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  longlong lStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  longlong lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  longlong lStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  longlong local_100;
  longlong lStack_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 local_60 [32];
  
  local_229c = 0;
  local_22a0 = 0;
  local_22a4 = 0;
  local_22a8 = 0;
  local_22ac = 0;
  local_22b0 = 0;
  local_22b8 = 0;
  local_22bc = 0;
  local_22c0 = 0;
  local_22c4 = 0;
  local_22c8 = 0;
  local_22d0 = 0;
  local_22d8 = 0;
  local_22e0 = 0;
  local_22e8 = (__m256i *)0x0;
  local_22f0 = (__m256i *)0x0;
  local_22f8 = (__m256i *)0x0;
  local_2300 = (__m256i *)0x0;
  local_2308 = (__m256i *)0x0;
  local_2310 = (__m256i *)0x0;
  local_2318 = (__m256i *)0x0;
  local_2320 = (__m256i *)0x0;
  local_2328 = (__m256i *)0x0;
  local_2330 = (__m256i *)0x0;
  local_2338 = (__m256i *)0x0;
  local_2340 = (__m256i *)0x0;
  local_2348 = (__m256i *)0x0;
  local_2350 = (__m256i *)0x0;
  local_2358 = (int8_t *)0x0;
  local_23a1 = 0;
  local_23a2 = 0;
  local_2401 = 0;
  local_2402 = 0;
  local_2403 = 0;
  local_2404 = 0;
  local_25a8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_8","profile");
    local_2278 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_8",
            "profile->profile8.score");
    local_2278 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_8",
            "profile->matrix");
    local_2278 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_8",
            "profile->s1Len");
    local_2278 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_avx2_256_8","s2");
    local_2278 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_8","s2Len"
           );
    local_2278 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_8","open"
           );
    local_2278 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_scan_profile_avx2_256_8","gap")
    ;
    local_2278 = (parasail_result_t *)0x0;
  }
  else {
    local_229c = 0;
    local_22a0 = 0;
    local_22a4 = 0;
    local_22a8 = *(int *)(in_RDI + 8);
    local_22ac = local_22a8 + -1;
    local_22b0 = in_EDX + -1;
    local_22b8 = *(long *)(in_RDI + 0x10);
    local_22bc = 0x20;
    local_22c0 = (local_22a8 + 0x1f) / 0x20;
    local_22c4 = (local_22a8 + -1) % (int)local_22c0;
    local_22c8 = ~((local_22a8 + -1) / (int)local_22c0) + 0x20;
    local_22d0 = *(long *)(in_RDI + 0x18);
    local_22d8 = *(long *)(in_RDI + 0x20);
    local_22e0 = *(long *)(in_RDI + 0x28);
    local_2290._0_1_ = (byte)in_ECX;
    local_2261 = (byte)local_2290;
    local_2081 = (byte)local_2290;
    local_2082 = (byte)local_2290;
    local_2083 = (byte)local_2290;
    local_2084 = (byte)local_2290;
    local_2085 = (byte)local_2290;
    local_2086 = (byte)local_2290;
    local_2087 = (byte)local_2290;
    local_2088 = (byte)local_2290;
    local_2089 = (byte)local_2290;
    local_208a = (byte)local_2290;
    local_208b = (byte)local_2290;
    local_208c = (byte)local_2290;
    local_208d = (byte)local_2290;
    local_208e = (byte)local_2290;
    local_208f = (byte)local_2290;
    local_2090 = (byte)local_2290;
    local_2091 = (byte)local_2290;
    local_2092 = (byte)local_2290;
    local_2093 = (byte)local_2290;
    local_2094 = (byte)local_2290;
    local_2095 = (byte)local_2290;
    local_2096 = (byte)local_2290;
    local_2097 = (byte)local_2290;
    local_2098 = (byte)local_2290;
    local_2099 = (byte)local_2290;
    local_209a = (byte)local_2290;
    local_209b = (byte)local_2290;
    local_209c = (byte)local_2290;
    local_209d = (byte)local_2290;
    local_209e = (byte)local_2290;
    local_209f = (byte)local_2290;
    local_20a0 = (byte)local_2290;
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_2290),in_ECX & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xe);
    local_20c0 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_2290),in_ECX & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xe);
    auStack_20b0 = vpinsrb_avx(auVar3,in_ECX & 0xff,0xf);
    local_2380 = local_20c0._0_8_;
    uStack_2378 = local_20c0._8_8_;
    uStack_2370 = auStack_20b0._0_8_;
    uStack_2368 = auStack_20b0._8_8_;
    local_2294._0_1_ = (byte)in_R8D;
    local_2262 = (byte)local_2294;
    local_2041 = (byte)local_2294;
    local_2042 = (byte)local_2294;
    local_2043 = (byte)local_2294;
    local_2044 = (byte)local_2294;
    local_2045 = (byte)local_2294;
    local_2046 = (byte)local_2294;
    local_2047 = (byte)local_2294;
    local_2048 = (byte)local_2294;
    local_2049 = (byte)local_2294;
    local_204a = (byte)local_2294;
    local_204b = (byte)local_2294;
    local_204c = (byte)local_2294;
    local_204d = (byte)local_2294;
    local_204e = (byte)local_2294;
    local_204f = (byte)local_2294;
    local_2050 = (byte)local_2294;
    local_2051 = (byte)local_2294;
    local_2052 = (byte)local_2294;
    local_2053 = (byte)local_2294;
    local_2054 = (byte)local_2294;
    local_2055 = (byte)local_2294;
    local_2056 = (byte)local_2294;
    local_2057 = (byte)local_2294;
    local_2058 = (byte)local_2294;
    local_2059 = (byte)local_2294;
    local_205a = (byte)local_2294;
    local_205b = (byte)local_2294;
    local_205c = (byte)local_2294;
    local_205d = (byte)local_2294;
    local_205e = (byte)local_2294;
    local_205f = (byte)local_2294;
    local_2060 = (byte)local_2294;
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_2294),in_R8D & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xe);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xf);
    auVar4 = vpinsrb_avx(ZEXT116((byte)local_2294),in_R8D & 0xff,1);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,2);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,3);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,4);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,5);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,6);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,7);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,8);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,9);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,10);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,0xb);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,0xc);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,0xd);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,0xe);
    auVar4 = vpinsrb_avx(auVar4,in_R8D & 0xff,0xf);
    local_2080._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    local_2080._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    if (*(int *)(local_22b8 + 0x20) <= (int)-in_ECX) {
      local_2290._0_1_ = -(char)*(undefined4 *)(local_22b8 + 0x20);
    }
    bVar43 = (byte)local_2290 + 0x81;
    bVar44 = (*(byte *)(local_22b8 + 0x1c) ^ 0x7f) - 1;
    local_2260._8_8_ = SUB328(ZEXT832(0),4);
    local_23e0 = 0;
    uStack_23d8 = local_2260._8_8_;
    uStack_23d0 = 0;
    uStack_23c8 = 0;
    local_2263 = 1;
    uVar50 = 1;
    local_2001 = 1;
    local_2002 = 1;
    local_2003 = 1;
    local_2004 = 1;
    local_2005 = 1;
    local_2006 = 1;
    local_2007 = 1;
    local_2008 = 1;
    local_2009 = 1;
    local_200a = 1;
    local_200b = 1;
    local_200c = 1;
    local_200d = 1;
    local_200e = 1;
    local_200f = 1;
    local_2010 = 1;
    local_2011 = 1;
    local_2012 = 1;
    local_2013 = 1;
    local_2014 = 1;
    local_2015 = 1;
    local_2016 = 1;
    local_2017 = 1;
    local_2018 = 1;
    local_2019 = 1;
    local_201a = 1;
    local_201b = 1;
    local_201c = 1;
    local_201d = 1;
    local_201e = 1;
    local_201f = 1;
    local_2020 = 1;
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    local_2040 = vpinsrb_avx(auVar3,1,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auStack_2030 = vpinsrb_avx(auVar3,1,0xf);
    local_2400 = local_2040._0_8_;
    uStack_23f8 = local_2040._8_8_;
    uStack_23f0 = auStack_2030._0_8_;
    uStack_23e8 = auStack_2030._8_8_;
    local_2402 = '\0';
    local_2403 = '\0';
    local_2404 = '\0';
    auVar3 = vpinsrb_avx(ZEXT116(bVar43),(uint)bVar43,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xe);
    local_2000 = vpinsrb_avx(auVar3,(uint)bVar43,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(bVar43),(uint)bVar43,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar43,0xe);
    auStack_1ff0 = vpinsrb_avx(auVar3,(uint)bVar43,0xf);
    local_2440 = local_2000._0_8_;
    uStack_2438 = local_2000._8_8_;
    uStack_2430 = auStack_1ff0._0_8_;
    uStack_2428 = auStack_1ff0._8_8_;
    auVar3 = vpinsrb_avx(ZEXT116(bVar44),(uint)bVar44,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xe);
    local_1fc0 = vpinsrb_avx(auVar3,(uint)bVar44,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(bVar44),(uint)bVar44,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar44,0xe);
    auStack_1fb0 = vpinsrb_avx(auVar3,(uint)bVar44,0xf);
    local_2460 = local_1fc0._0_8_;
    uStack_2458 = local_1fc0._8_8_;
    uStack_2450 = auStack_1fb0._0_8_;
    uStack_2448 = auStack_1fb0._8_8_;
    local_2480._16_8_ = auStack_1fb0._0_8_;
    local_2480._0_16_ = local_1fc0;
    local_2480._24_8_ = auStack_1fb0._8_8_;
    local_24a0._16_8_ = auStack_1ff0._0_8_;
    local_24a0._0_16_ = local_2000;
    local_24a0._24_8_ = auStack_1ff0._8_8_;
    local_24c0._16_8_ = auStack_1ff0._0_8_;
    local_24c0._0_16_ = local_2000;
    local_24c0._24_8_ = auStack_1ff0._8_8_;
    local_24e0._16_8_ = auStack_1ff0._0_8_;
    local_24e0._0_16_ = local_2000;
    local_24e0._24_8_ = auStack_1ff0._8_8_;
    local_2500._16_8_ = auStack_1ff0._0_8_;
    local_2500._0_16_ = local_2000;
    local_2500._24_8_ = auStack_1ff0._8_8_;
    local_2520._16_8_ = auStack_1ff0._0_8_;
    local_2520._0_16_ = local_2000;
    local_2520._24_8_ = auStack_1ff0._8_8_;
    local_2266 = (byte)local_22c8;
    local_1f41 = (byte)local_22c8;
    local_1f42 = (byte)local_22c8;
    local_1f43 = (byte)local_22c8;
    local_1f44 = (byte)local_22c8;
    local_1f45 = (byte)local_22c8;
    local_1f46 = (byte)local_22c8;
    local_1f47 = (byte)local_22c8;
    local_1f48 = (byte)local_22c8;
    local_1f49 = (byte)local_22c8;
    local_1f4a = (byte)local_22c8;
    local_1f4b = (byte)local_22c8;
    local_1f4c = (byte)local_22c8;
    local_1f4d = (byte)local_22c8;
    local_1f4e = (byte)local_22c8;
    local_1f4f = (byte)local_22c8;
    local_1f50 = (byte)local_22c8;
    local_1f51 = (byte)local_22c8;
    local_1f52 = (byte)local_22c8;
    local_1f53 = (byte)local_22c8;
    local_1f54 = (byte)local_22c8;
    local_1f55 = (byte)local_22c8;
    local_1f56 = (byte)local_22c8;
    local_1f57 = (byte)local_22c8;
    local_1f58 = (byte)local_22c8;
    local_1f59 = (byte)local_22c8;
    local_1f5a = (byte)local_22c8;
    local_1f5b = (byte)local_22c8;
    local_1f5c = (byte)local_22c8;
    local_1f5d = (byte)local_22c8;
    local_1f5e = (byte)local_22c8;
    local_1f5f = (byte)local_22c8;
    local_1f60 = (byte)local_22c8;
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c8),local_22c8 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xe);
    local_1f80 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c8),local_22c8 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xe);
    auStack_1f70 = vpinsrb_avx(auVar3,local_22c8 & 0xff,0xf);
    local_1d81 = 0;
    local_1d82 = 1;
    local_1d83 = 2;
    local_1d84 = 3;
    local_1d85 = 4;
    local_1d86 = 5;
    local_1d87 = 6;
    local_1d88 = 7;
    local_1d89 = 8;
    local_1d8a = 9;
    local_1d8b = 10;
    local_1d8c = 0xb;
    local_1d8d = 0xc;
    local_1d8e = 0xd;
    local_1d8f = 0xe;
    local_1d90 = 0xf;
    local_1d91 = 0x10;
    local_1d92 = 0x11;
    local_1d93 = 0x12;
    local_1d94 = 0x13;
    local_1d95 = 0x14;
    local_1d96 = 0x15;
    local_1d97 = 0x16;
    local_1d98 = 0x17;
    local_1d99 = 0x18;
    local_1d9a = 0x19;
    local_1d9b = 0x1a;
    local_1d9c = 0x1b;
    local_1d9d = 0x1c;
    local_1d9e = 0x1d;
    local_1d9f = 0x1e;
    local_1da0 = 0x1f;
    auVar3 = vpinsrb_avx(ZEXT116(0x1f),0x1e,1);
    auVar3 = vpinsrb_avx(auVar3,0x1d,2);
    auVar3 = vpinsrb_avx(auVar3,0x1c,3);
    auVar3 = vpinsrb_avx(auVar3,0x1b,4);
    auVar3 = vpinsrb_avx(auVar3,0x1a,5);
    auVar3 = vpinsrb_avx(auVar3,0x19,6);
    auVar3 = vpinsrb_avx(auVar3,0x18,7);
    auVar3 = vpinsrb_avx(auVar3,0x17,8);
    auVar3 = vpinsrb_avx(auVar3,0x16,9);
    auVar3 = vpinsrb_avx(auVar3,0x15,10);
    auVar3 = vpinsrb_avx(auVar3,0x14,0xb);
    auVar3 = vpinsrb_avx(auVar3,0x13,0xc);
    auVar3 = vpinsrb_avx(auVar3,0x12,0xd);
    auVar3 = vpinsrb_avx(auVar3,0x11,0xe);
    local_1dc0 = vpinsrb_avx(auVar3,0x10,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(0xf),0xe,1);
    auVar3 = vpinsrb_avx(auVar3,0xd,2);
    auVar3 = vpinsrb_avx(auVar3,0xc,3);
    auVar3 = vpinsrb_avx(auVar3,0xb,4);
    auVar3 = vpinsrb_avx(auVar3,10,5);
    auVar3 = vpinsrb_avx(auVar3,9,6);
    auVar3 = vpinsrb_avx(auVar3,8,7);
    auVar3 = vpinsrb_avx(auVar3,7,8);
    auVar3 = vpinsrb_avx(auVar3,6,9);
    auVar3 = vpinsrb_avx(auVar3,5,10);
    auVar3 = vpinsrb_avx(auVar3,4,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,2,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auStack_1db0 = vpinsrb_avx(auVar3,0,0xf);
    local_20e0 = local_1f80._0_8_;
    uStack_20d8 = local_1f80._8_8_;
    uStack_20d0 = auStack_1f70._0_8_;
    uStack_20c8 = auStack_1f70._8_8_;
    local_2100 = local_1dc0._0_8_;
    uStack_20f8 = local_1dc0._8_8_;
    uStack_20f0 = auStack_1db0._0_8_;
    uStack_20e8 = auStack_1db0._8_8_;
    auVar13._16_8_ = auStack_1f70._0_8_;
    auVar13._0_16_ = local_1f80;
    auVar13._24_8_ = auStack_1f70._8_8_;
    auVar12._16_8_ = auStack_1db0._0_8_;
    auVar12._0_16_ = local_1dc0;
    auVar12._24_8_ = auStack_1db0._8_8_;
    local_2540 = vpcmpeqb_avx2(auVar13,auVar12);
    uStack_2558 = local_2260._8_8_;
    uStack_2550 = 0;
    uStack_2548 = 0;
    local_2267 = (byte)local_22c0;
    local_1f01 = (byte)local_22c0;
    local_1f02 = (byte)local_22c0;
    local_1f03 = (byte)local_22c0;
    local_1f04 = (byte)local_22c0;
    local_1f05 = (byte)local_22c0;
    local_1f06 = (byte)local_22c0;
    local_1f07 = (byte)local_22c0;
    local_1f08 = (byte)local_22c0;
    local_1f09 = (byte)local_22c0;
    local_1f0a = (byte)local_22c0;
    local_1f0b = (byte)local_22c0;
    local_1f0c = (byte)local_22c0;
    local_1f0d = (byte)local_22c0;
    local_1f0e = (byte)local_22c0;
    local_1f0f = (byte)local_22c0;
    local_1f10 = (byte)local_22c0;
    local_1f11 = (byte)local_22c0;
    local_1f12 = (byte)local_22c0;
    local_1f13 = (byte)local_22c0;
    local_1f14 = (byte)local_22c0;
    local_1f15 = (byte)local_22c0;
    local_1f16 = (byte)local_22c0;
    local_1f17 = (byte)local_22c0;
    local_1f18 = (byte)local_22c0;
    local_1f19 = (byte)local_22c0;
    local_1f1a = (byte)local_22c0;
    local_1f1b = (byte)local_22c0;
    local_1f1c = (byte)local_22c0;
    local_1f1d = (byte)local_22c0;
    local_1f1e = (byte)local_22c0;
    local_1f1f = (byte)local_22c0;
    local_1f20 = (byte)local_22c0;
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c0),local_22c0 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xe);
    local_1f40 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c0),local_22c0 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xe);
    auStack_1f30 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xf);
    auVar11._16_16_ = auStack_1f30;
    auVar11._0_16_ = local_1f40;
    local_2268 = (byte)local_22c0;
    local_1ec1 = (byte)local_22c0;
    local_1ec2 = (byte)local_22c0;
    local_1ec3 = (byte)local_22c0;
    local_1ec4 = (byte)local_22c0;
    local_1ec5 = (byte)local_22c0;
    local_1ec6 = (byte)local_22c0;
    local_1ec7 = (byte)local_22c0;
    local_1ec8 = (byte)local_22c0;
    local_1ec9 = (byte)local_22c0;
    local_1eca = (byte)local_22c0;
    local_1ecb = (byte)local_22c0;
    local_1ecc = (byte)local_22c0;
    local_1ecd = (byte)local_22c0;
    local_1ece = (byte)local_22c0;
    local_1ecf = (byte)local_22c0;
    local_1ed0 = (byte)local_22c0;
    local_1ed1 = (byte)local_22c0;
    local_1ed2 = (byte)local_22c0;
    local_1ed3 = (byte)local_22c0;
    local_1ed4 = (byte)local_22c0;
    local_1ed5 = (byte)local_22c0;
    local_1ed6 = (byte)local_22c0;
    local_1ed7 = (byte)local_22c0;
    local_1ed8 = (byte)local_22c0;
    local_1ed9 = (byte)local_22c0;
    local_1eda = (byte)local_22c0;
    local_1edb = (byte)local_22c0;
    local_1edc = (byte)local_22c0;
    local_1edd = (byte)local_22c0;
    local_1ede = (byte)local_22c0;
    local_1edf = (byte)local_22c0;
    local_1ee0 = (byte)local_22c0;
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c0),local_22c0 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xe);
    local_1f00 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c0),local_22c0 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xe);
    auStack_1ef0 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xf);
    auVar6._16_16_ = auStack_1ef0;
    auVar6._0_16_ = local_1f00;
    local_2269 = (byte)local_22c0;
    local_1e81 = (byte)local_22c0;
    local_1e82 = (byte)local_22c0;
    local_1e83 = (byte)local_22c0;
    local_1e84 = (byte)local_22c0;
    local_1e85 = (byte)local_22c0;
    local_1e86 = (byte)local_22c0;
    local_1e87 = (byte)local_22c0;
    local_1e88 = (byte)local_22c0;
    local_1e89 = (byte)local_22c0;
    local_1e8a = (byte)local_22c0;
    local_1e8b = (byte)local_22c0;
    local_1e8c = (byte)local_22c0;
    local_1e8d = (byte)local_22c0;
    local_1e8e = (byte)local_22c0;
    local_1e8f = (byte)local_22c0;
    local_1e90 = (byte)local_22c0;
    local_1e91 = (byte)local_22c0;
    local_1e92 = (byte)local_22c0;
    local_1e93 = (byte)local_22c0;
    local_1e94 = (byte)local_22c0;
    local_1e95 = (byte)local_22c0;
    local_1e96 = (byte)local_22c0;
    local_1e97 = (byte)local_22c0;
    local_1e98 = (byte)local_22c0;
    local_1e99 = (byte)local_22c0;
    local_1e9a = (byte)local_22c0;
    local_1e9b = (byte)local_22c0;
    local_1e9c = (byte)local_22c0;
    local_1e9d = (byte)local_22c0;
    local_1e9e = (byte)local_22c0;
    local_1e9f = (byte)local_22c0;
    local_1ea0 = (byte)local_22c0;
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c0),local_22c0 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xe);
    local_1ec0 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_22c0),local_22c0 & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xe);
    local_1eb0 = vpinsrb_avx(auVar3,local_22c0 & 0xff,0xf);
    auVar12 = vperm2i128_avx2(ZEXT1632(local_1ec0),auVar6,0x28);
    local_25a0 = vpalignr_avx2(auVar11,auVar12,0xf);
    local_2560 = (ulong)bVar43;
    bVar45 = -(byte)local_22c0 * (byte)local_2294;
    auVar3 = vpinsrb_avx(ZEXT116(bVar45),(uint)bVar45,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xe);
    local_1e80 = vpinsrb_avx(auVar3,(uint)bVar45,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(bVar45),(uint)bVar45,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar45,0xe);
    auStack_1e70 = vpinsrb_avx(auVar3,(uint)bVar45,0xf);
    auVar7._16_16_ = auStack_1e70;
    auVar7._0_16_ = local_1e80;
    bVar46 = -(byte)local_22c0 * (byte)local_2294;
    auVar3 = vpinsrb_avx(ZEXT116(bVar46),(uint)bVar46,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xe);
    local_1e40 = vpinsrb_avx(auVar3,(uint)bVar46,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(bVar46),(uint)bVar46,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar46,0xe);
    auStack_1e30 = vpinsrb_avx(auVar3,(uint)bVar46,0xf);
    auVar8._16_16_ = auStack_1e30;
    auVar8._0_16_ = local_1e40;
    bVar47 = -(byte)local_22c0 * (byte)local_2294;
    auVar3 = vpinsrb_avx(ZEXT116(bVar47),(uint)bVar47,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xe);
    local_1e00 = vpinsrb_avx(auVar3,(uint)bVar47,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(bVar47),(uint)bVar47,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar47,0xe);
    local_1df0 = vpinsrb_avx(auVar3,(uint)bVar47,0xf);
    auVar12 = vperm2i128_avx2(ZEXT1632(local_1e00),auVar8,0x28);
    local_1a00 = vpalignr_avx2(auVar7,auVar12,0xf);
    local_19e0 = local_2560;
    uStack_19d8 = local_2260._8_8_;
    uStack_19d0 = 0;
    uStack_19c8 = 0;
    local_2580 = vpaddsb_avx2(ZEXT1632(CONCAT88(local_2260._8_8_,local_2560)),local_1a00);
    bVar51 = (byte)local_22c8;
    bVar52 = (byte)local_22c0;
    bVar53 = (byte)local_22c0;
    bVar54 = (byte)local_22c0;
    local_2401 = bVar43;
    local_23a2 = bVar44;
    local_23a1 = bVar43;
    local_2298 = in_R9D;
    local_2294 = in_R8D;
    local_2290 = in_ECX;
    local_228c = in_EDX;
    local_2288 = in_RSI;
    local_226c = bVar47;
    local_226b = bVar46;
    local_226a = bVar45;
    local_2265 = bVar44;
    local_2264 = bVar43;
    local_2260 = ZEXT832(0) << 0x20;
    local_1fe0 = bVar43;
    local_1fdf = bVar43;
    local_1fde = bVar43;
    local_1fdd = bVar43;
    local_1fdc = bVar43;
    local_1fdb = bVar43;
    local_1fda = bVar43;
    local_1fd9 = bVar43;
    local_1fd8 = bVar43;
    local_1fd7 = bVar43;
    local_1fd6 = bVar43;
    local_1fd5 = bVar43;
    local_1fd4 = bVar43;
    local_1fd3 = bVar43;
    local_1fd2 = bVar43;
    local_1fd1 = bVar43;
    local_1fd0 = bVar43;
    local_1fcf = bVar43;
    local_1fce = bVar43;
    local_1fcd = bVar43;
    local_1fcc = bVar43;
    local_1fcb = bVar43;
    local_1fca = bVar43;
    local_1fc9 = bVar43;
    local_1fc8 = bVar43;
    local_1fc7 = bVar43;
    local_1fc6 = bVar43;
    local_1fc5 = bVar43;
    local_1fc4 = bVar43;
    local_1fc3 = bVar43;
    local_1fc2 = bVar43;
    local_1fc1 = bVar43;
    local_1fa0 = bVar44;
    local_1f9f = bVar44;
    local_1f9e = bVar44;
    local_1f9d = bVar44;
    local_1f9c = bVar44;
    local_1f9b = bVar44;
    local_1f9a = bVar44;
    local_1f99 = bVar44;
    local_1f98 = bVar44;
    local_1f97 = bVar44;
    local_1f96 = bVar44;
    local_1f95 = bVar44;
    local_1f94 = bVar44;
    local_1f93 = bVar44;
    local_1f92 = bVar44;
    local_1f91 = bVar44;
    local_1f90 = bVar44;
    local_1f8f = bVar44;
    local_1f8e = bVar44;
    local_1f8d = bVar44;
    local_1f8c = bVar44;
    local_1f8b = bVar44;
    local_1f8a = bVar44;
    local_1f89 = bVar44;
    local_1f88 = bVar44;
    local_1f87 = bVar44;
    local_1f86 = bVar44;
    local_1f85 = bVar44;
    local_1f84 = bVar44;
    local_1f83 = bVar44;
    local_1f82 = bVar44;
    local_1f81 = bVar44;
    local_1e60 = bVar45;
    local_1e5f = bVar45;
    local_1e5e = bVar45;
    local_1e5d = bVar45;
    local_1e5c = bVar45;
    local_1e5b = bVar45;
    local_1e5a = bVar45;
    local_1e59 = bVar45;
    local_1e58 = bVar45;
    local_1e57 = bVar45;
    local_1e56 = bVar45;
    local_1e55 = bVar45;
    local_1e54 = bVar45;
    local_1e53 = bVar45;
    local_1e52 = bVar45;
    local_1e51 = bVar45;
    local_1e50 = bVar45;
    local_1e4f = bVar45;
    local_1e4e = bVar45;
    local_1e4d = bVar45;
    local_1e4c = bVar45;
    local_1e4b = bVar45;
    local_1e4a = bVar45;
    local_1e49 = bVar45;
    local_1e48 = bVar45;
    local_1e47 = bVar45;
    local_1e46 = bVar45;
    local_1e45 = bVar45;
    local_1e44 = bVar45;
    local_1e43 = bVar45;
    local_1e42 = bVar45;
    local_1e41 = bVar45;
    local_1e20 = bVar46;
    local_1e1f = bVar46;
    local_1e1e = bVar46;
    local_1e1d = bVar46;
    local_1e1c = bVar46;
    local_1e1b = bVar46;
    local_1e1a = bVar46;
    local_1e19 = bVar46;
    local_1e18 = bVar46;
    local_1e17 = bVar46;
    local_1e16 = bVar46;
    local_1e15 = bVar46;
    local_1e14 = bVar46;
    local_1e13 = bVar46;
    local_1e12 = bVar46;
    local_1e11 = bVar46;
    local_1e10 = bVar46;
    local_1e0f = bVar46;
    local_1e0e = bVar46;
    local_1e0d = bVar46;
    local_1e0c = bVar46;
    local_1e0b = bVar46;
    local_1e0a = bVar46;
    local_1e09 = bVar46;
    local_1e08 = bVar46;
    local_1e07 = bVar46;
    local_1e06 = bVar46;
    local_1e05 = bVar46;
    local_1e04 = bVar46;
    local_1e03 = bVar46;
    local_1e02 = bVar46;
    local_1e01 = bVar46;
    local_1de0 = bVar47;
    local_1ddf = bVar47;
    local_1dde = bVar47;
    local_1ddd = bVar47;
    local_1ddc = bVar47;
    local_1ddb = bVar47;
    local_1dda = bVar47;
    local_1dd9 = bVar47;
    local_1dd8 = bVar47;
    local_1dd7 = bVar47;
    local_1dd6 = bVar47;
    local_1dd5 = bVar47;
    local_1dd4 = bVar47;
    local_1dd3 = bVar47;
    local_1dd2 = bVar47;
    local_1dd1 = bVar47;
    local_1dd0 = bVar47;
    local_1dcf = bVar47;
    local_1dce = bVar47;
    local_1dcd = bVar47;
    local_1dcc = bVar47;
    local_1dcb = bVar47;
    local_1dca = bVar47;
    local_1dc9 = bVar47;
    local_1dc8 = bVar47;
    local_1dc7 = bVar47;
    local_1dc6 = bVar47;
    local_1dc5 = bVar47;
    local_1dc4 = bVar47;
    local_1dc3 = bVar47;
    local_1dc2 = bVar47;
    local_1dc1 = bVar47;
    local_23a0 = local_2080._0_16_;
    auStack_2390 = local_2080._16_16_;
    local_25a8 = parasail_result_new_stats();
    if (local_25a8 == (parasail_result_t *)0x0) {
      local_2278 = (parasail_result_t *)0x0;
    }
    else {
      local_25a8->flag = local_25a8->flag | 0x20110402;
      uVar14 = 0;
      if (local_2298 != 0) {
        uVar14 = 8;
      }
      local_25a8->flag = uVar14 | local_25a8->flag;
      uVar14 = 0;
      if (in_stack_00000008 != 0) {
        uVar14 = 0x10;
      }
      local_25a8->flag = uVar14 | local_25a8->flag;
      uVar14 = 0;
      if (s1_end != 0) {
        uVar14 = 0x4000;
      }
      local_25a8->flag = uVar14 | local_25a8->flag;
      uVar14 = 0;
      if (s2_beg != 0) {
        uVar14 = 0x8000;
      }
      local_25a8->flag = uVar14 | local_25a8->flag;
      local_22e8 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_22f0 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_22f8 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2300 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2308 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2310 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2318 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2320 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2328 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2330 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2338 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2340 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2348 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2350 = parasail_memalign___m256i(0x20,(long)(int)local_22c0);
      local_2358 = parasail_memalign_int8_t(0x20,(long)(local_228c + 1));
      if (local_22e8 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_22f0 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_22f8 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2300 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2308 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2310 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2318 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2320 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2328 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2330 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2338 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2340 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2348 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2350 == (__m256i *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else if (local_2358 == (int8_t *)0x0) {
        local_2278 = (parasail_result_t *)0x0;
      }
      else {
        alVar5[0]._4_4_ = in_stack_ffffffffffffd3dc;
        alVar5[0]._0_4_ = in_stack_ffffffffffffd3d8;
        alVar5[1] = in_stack_ffffffffffffd3e0;
        alVar5[2]._0_4_ = in_stack_ffffffffffffd3e8;
        alVar5[2]._4_2_ = in_stack_ffffffffffffd3ec;
        alVar5[2]._6_1_ = uVar50;
        alVar5[2]._7_1_ = bVar43;
        alVar5[3]._0_1_ = bVar44;
        alVar5[3]._1_1_ = bVar51;
        alVar5[3]._2_1_ = bVar52;
        alVar5[3]._3_1_ = bVar53;
        alVar5[3]._4_1_ = bVar54;
        alVar5[3]._5_1_ = bVar45;
        alVar5[3]._6_1_ = bVar46;
        alVar5[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,alVar5,in_stack_ffffffffffffd3d0);
        alVar15[0]._4_4_ = in_stack_ffffffffffffd3dc;
        alVar15[0]._0_4_ = in_stack_ffffffffffffd3d8;
        alVar15[1] = in_stack_ffffffffffffd3e0;
        alVar15[2]._0_4_ = in_stack_ffffffffffffd3e8;
        alVar15[2]._4_2_ = in_stack_ffffffffffffd3ec;
        alVar15[2]._6_1_ = uVar50;
        alVar15[2]._7_1_ = bVar43;
        alVar15[3]._0_1_ = bVar44;
        alVar15[3]._1_1_ = bVar51;
        alVar15[3]._2_1_ = bVar52;
        alVar15[3]._3_1_ = bVar53;
        alVar15[3]._4_1_ = bVar54;
        alVar15[3]._5_1_ = bVar45;
        alVar15[3]._6_1_ = bVar46;
        alVar15[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,alVar15,in_stack_ffffffffffffd3d0);
        alVar16[0]._4_4_ = in_stack_ffffffffffffd3dc;
        alVar16[0]._0_4_ = in_stack_ffffffffffffd3d8;
        alVar16[1] = in_stack_ffffffffffffd3e0;
        alVar16[2]._0_4_ = in_stack_ffffffffffffd3e8;
        alVar16[2]._4_2_ = in_stack_ffffffffffffd3ec;
        alVar16[2]._6_1_ = uVar50;
        alVar16[2]._7_1_ = bVar43;
        alVar16[3]._0_1_ = bVar44;
        alVar16[3]._1_1_ = bVar51;
        alVar16[3]._2_1_ = bVar52;
        alVar16[3]._3_1_ = bVar53;
        alVar16[3]._4_1_ = bVar54;
        alVar16[3]._5_1_ = bVar45;
        alVar16[3]._6_1_ = bVar46;
        alVar16[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,alVar16,in_stack_ffffffffffffd3d0);
        alVar17[0]._4_4_ = in_stack_ffffffffffffd3dc;
        alVar17[0]._0_4_ = in_stack_ffffffffffffd3d8;
        alVar17[1] = in_stack_ffffffffffffd3e0;
        alVar17[2]._0_4_ = in_stack_ffffffffffffd3e8;
        alVar17[2]._4_2_ = in_stack_ffffffffffffd3ec;
        alVar17[2]._6_1_ = uVar50;
        alVar17[2]._7_1_ = bVar43;
        alVar17[3]._0_1_ = bVar44;
        alVar17[3]._1_1_ = bVar51;
        alVar17[3]._2_1_ = bVar52;
        alVar17[3]._3_1_ = bVar53;
        alVar17[3]._4_1_ = bVar54;
        alVar17[3]._5_1_ = bVar45;
        alVar17[3]._6_1_ = bVar46;
        alVar17[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,alVar17,in_stack_ffffffffffffd3d0);
        alVar18[0]._4_4_ = in_stack_ffffffffffffd3dc;
        alVar18[0]._0_4_ = in_stack_ffffffffffffd3d8;
        alVar18[1] = in_stack_ffffffffffffd3e0;
        alVar18[2]._0_4_ = in_stack_ffffffffffffd3e8;
        alVar18[2]._4_2_ = in_stack_ffffffffffffd3ec;
        alVar18[2]._6_1_ = uVar50;
        alVar18[2]._7_1_ = bVar43;
        alVar18[3]._0_1_ = bVar44;
        alVar18[3]._1_1_ = bVar51;
        alVar18[3]._2_1_ = bVar52;
        alVar18[3]._3_1_ = bVar53;
        alVar18[3]._4_1_ = bVar54;
        alVar18[3]._5_1_ = bVar45;
        alVar18[3]._6_1_ = bVar46;
        alVar18[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,alVar18,in_stack_ffffffffffffd3d0);
        c[0]._4_4_ = in_stack_ffffffffffffd3dc;
        c[0]._0_4_ = in_stack_ffffffffffffd3d8;
        c[1] = in_stack_ffffffffffffd3e0;
        c[2]._0_4_ = in_stack_ffffffffffffd3e8;
        c[2]._4_2_ = in_stack_ffffffffffffd3ec;
        c[2]._6_1_ = uVar50;
        c[2]._7_1_ = bVar43;
        c[3]._0_1_ = bVar44;
        c[3]._1_1_ = bVar51;
        c[3]._2_1_ = bVar52;
        c[3]._3_1_ = bVar53;
        c[3]._4_1_ = bVar54;
        c[3]._5_1_ = bVar45;
        c[3]._6_1_ = bVar46;
        c[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,c,in_stack_ffffffffffffd3d0);
        c_00[0]._4_4_ = in_stack_ffffffffffffd3dc;
        c_00[0]._0_4_ = in_stack_ffffffffffffd3d8;
        c_00[1] = in_stack_ffffffffffffd3e0;
        c_00[2]._0_4_ = in_stack_ffffffffffffd3e8;
        c_00[2]._4_2_ = in_stack_ffffffffffffd3ec;
        c_00[2]._6_1_ = uVar50;
        c_00[2]._7_1_ = bVar43;
        c_00[3]._0_1_ = bVar44;
        c_00[3]._1_1_ = bVar51;
        c_00[3]._2_1_ = bVar52;
        c_00[3]._3_1_ = bVar53;
        c_00[3]._4_1_ = bVar54;
        c_00[3]._5_1_ = bVar45;
        c_00[3]._6_1_ = bVar46;
        c_00[3]._7_1_ = bVar47;
        parasail_memset___m256i(local_2c00,c_00,in_stack_ffffffffffffd3d0);
        local_1820 = local_23e0;
        uStack_1818 = uStack_23d8;
        uStack_1810 = uStack_23d0;
        uStack_1808 = uStack_23c8;
        local_1840 = local_2380;
        uStack_1838 = uStack_2378;
        uStack_1830 = uStack_2370;
        uStack_1828 = uStack_2368;
        auVar10._8_8_ = uStack_23d8;
        auVar10._0_8_ = local_23e0;
        auVar10._16_8_ = uStack_23d0;
        auVar10._24_8_ = uStack_23c8;
        auVar9._8_8_ = uStack_2378;
        auVar9._0_8_ = local_2380;
        auVar9._16_8_ = uStack_2370;
        auVar9._24_8_ = uStack_2368;
        local_25e0 = vpsubsb_avx2(auVar10,auVar9);
        local_2600._8_8_ = uStack_23f8;
        local_2600._0_8_ = local_2400;
        local_2600._16_8_ = uStack_23f0;
        local_2600._24_8_ = uStack_23e8;
        local_229c = local_22c0;
        while (local_229c = local_229c - 1, -1 < (int)local_229c) {
          local_1460 = local_2348 + (int)local_229c;
          local_1480 = local_25e0._0_8_;
          lStack_1478 = local_25e0._8_8_;
          lStack_1470 = local_25e0._16_8_;
          lStack_1468 = local_25e0._24_8_;
          (*local_1460)[0] = local_25e0._0_8_;
          (*local_1460)[1] = local_25e0._8_8_;
          (*local_1460)[2] = local_25e0._16_8_;
          (*local_1460)[3] = local_25e0._24_8_;
          local_1488 = local_2350 + (int)local_229c;
          local_14c0 = local_2600._0_8_;
          lStack_14b8 = local_2600._8_8_;
          lStack_14b0 = local_2600._16_8_;
          lStack_14a8 = local_2600._24_8_;
          (*local_1488)[0] = local_2600._0_8_;
          (*local_1488)[1] = local_2600._8_8_;
          (*local_1488)[2] = local_2600._16_8_;
          (*local_1488)[3] = local_2600._24_8_;
          local_1860 = local_25e0._0_8_;
          lStack_1858 = local_25e0._8_8_;
          lStack_1850 = local_25e0._16_8_;
          lStack_1848 = local_25e0._24_8_;
          uStack_1870 = auStack_2390._0_8_;
          uStack_1868 = auStack_2390._8_8_;
          auVar29._16_8_ = auStack_2390._0_8_;
          auVar29._0_16_ = local_23a0;
          auVar29._24_8_ = auStack_2390._8_8_;
          local_25e0 = vpsubsb_avx2(local_25e0,auVar29);
          local_1a20 = local_2600._0_8_;
          lStack_1a18 = local_2600._8_8_;
          lStack_1a10 = local_2600._16_8_;
          lStack_1a08 = local_2600._24_8_;
          local_1a40 = local_2400;
          uStack_1a38 = uStack_23f8;
          uStack_1a30 = uStack_23f0;
          uStack_1a28 = uStack_23e8;
          auVar9._8_8_ = uStack_23f8;
          auVar9._0_8_ = local_2400;
          auVar9._16_8_ = uStack_23f0;
          auVar9._24_8_ = uStack_23e8;
          local_2600 = vpaddsb_avx2(local_2600,auVar9);
          local_1880 = local_23a0;
        }
        local_2604 = 0;
        local_229c = 0;
        while( true ) {
          if ((int)local_22c0 <= (int)local_229c) break;
          for (local_2608 = 0; local_2608 < local_22bc; local_2608 = local_2608 + 1) {
            if (local_2298 == 0) {
              iVar49 = -(local_2294 * (local_2608 * local_22c0 + local_229c)) - local_2290;
            }
            else {
              iVar49 = 0;
            }
            if (iVar49 < -0x80) {
              iVar49 = -0x80;
            }
            *(char *)((long)&local_2640 + (long)local_2608) = (char)iVar49;
          }
          local_14c8 = local_2308 + local_2604;
          (*local_14c8)[0] = local_2640;
          (*local_14c8)[1] = lStack_2638;
          (*local_14c8)[2] = lStack_2630;
          (*local_14c8)[3] = lStack_2628;
          local_2604 = local_2604 + 1;
          local_229c = local_229c + 1;
        }
        *local_2358 = '\0';
        for (local_229c = 1; (int)local_229c <= local_228c; local_229c = local_229c + 1) {
          if (s1_end == 0) {
            iVar49 = -(local_2294 * (local_229c + -1)) - local_2290;
          }
          else {
            iVar49 = 0;
          }
          if (iVar49 < -0x80) {
            iVar49 = -0x80;
          }
          local_2358[(int)local_229c] = (int8_t)iVar49;
        }
        for (local_22a0 = 0; auVar48 = ZEXT3264(auVar9), local_22a0 < local_228c;
            local_22a0 = local_22a0 + 1) {
          local_1348 = local_2308 + (int)(local_22c0 - 1);
          local_1350 = local_2310 + (int)(local_22c0 - 1);
          local_1358 = local_2318 + (int)(local_22c0 - 1);
          local_1360 = local_2320 + (int)(local_22c0 - 1);
          auVar13 = vperm2i128_avx2(auVar9,(undefined1  [32])*local_1348,0x28);
          auVar12 = vpalignr_avx2((undefined1  [32])*local_1348,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,(undefined1  [32])*local_1350,0x28);
          local_2920 = (__m256i)vpalignr_avx2((undefined1  [32])*local_1350,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,(undefined1  [32])*local_1358,0x28);
          local_2940 = (__m256i)vpalignr_avx2((undefined1  [32])*local_1358,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,(undefined1  [32])*local_1360,0x28);
          local_2960 = (__m256i)vpalignr_avx2((undefined1  [32])*local_1360,auVar13,0xf);
          auVar3 = vpinsrb_avx(auVar12._0_16_,(uint)(byte)local_2358[local_22a0],0);
          local_2900 = (__m256i)vblendps_avx(auVar12,ZEXT1632(auVar3),0xf);
          iVar49 = *(int *)(*(long *)(local_22b8 + 0x10) +
                           (ulong)*(byte *)(local_2288 + local_22a0) * 4);
          iVar1 = *(int *)(*(long *)(local_22b8 + 0x10) +
                          (ulong)*(byte *)(local_2288 + local_22a0) * 4);
          iVar2 = *(int *)(*(long *)(local_22b8 + 0x10) +
                          (ulong)*(byte *)(local_2288 + local_22a0) * 4);
          local_18a0 = local_2440;
          uStack_1898 = uStack_2438;
          uStack_1890 = uStack_2430;
          uStack_1888 = uStack_2428;
          local_18c0 = (*local_2348)[0];
          lStack_18b8 = (*local_2348)[1];
          lStack_18b0 = (*local_2348)[2];
          lStack_18a8 = (*local_2348)[3];
          alVar5 = *local_2348;
          auVar28._8_8_ = uStack_2438;
          auVar28._0_8_ = local_2440;
          auVar28._16_8_ = uStack_2430;
          auVar28._24_8_ = uStack_2428;
          _local_2740 = vpsubsb_avx2(auVar28,(undefined1  [32])alVar5);
          local_27c0._8_8_ = uStack_2438;
          local_27c0._0_8_ = local_2440;
          local_27c0._16_8_ = uStack_2430;
          local_27c0._24_8_ = uStack_2428;
          local_2820._8_8_ = uStack_23d8;
          local_2820._0_8_ = local_23e0;
          local_2820._16_8_ = uStack_23d0;
          local_2820._24_8_ = uStack_23c8;
          local_2840._8_8_ = uStack_23d8;
          local_2840._0_8_ = local_23e0;
          local_2840._16_8_ = uStack_23d0;
          local_2840._24_8_ = uStack_23c8;
          local_2860._8_8_ = uStack_23d8;
          local_2860._0_8_ = local_23e0;
          local_2860._16_8_ = uStack_23d0;
          local_2860._24_8_ = uStack_23c8;
          local_229c = 0;
          while( true ) {
            if ((int)local_22c0 <= (int)local_229c) break;
            local_1368 = local_2308 + (int)local_229c;
            auVar34 = *(undefined1 (*) [24])*local_1368;
            lStack_18c8 = (*local_1368)[3];
            alVar15 = *local_1368;
            local_1370 = local_2310 + (int)local_229c;
            auVar35 = *(undefined1 (*) [24])*local_1370;
            lStack_228 = (*local_1370)[3];
            alVar16 = *local_1370;
            local_1378 = local_2318 + (int)local_229c;
            auVar36 = *(undefined1 (*) [24])*local_1378;
            lStack_288 = (*local_1378)[3];
            alVar17 = *local_1378;
            local_1380 = local_2320 + (int)local_229c;
            auVar37 = *(undefined1 (*) [24])*local_1380;
            lStack_2e8 = (*local_1380)[3];
            alVar18 = *local_1380;
            local_1388 = local_22e8 + (int)local_229c;
            auVar38 = *(undefined1 (*) [24])*local_1388;
            lStack_1908 = (*local_1388)[3];
            local_1390 = local_22f0 + (int)local_229c;
            auVar39 = *(undefined1 (*) [24])*local_1390;
            lStack_208 = (*local_1390)[3];
            local_1398 = local_22f8 + (int)local_229c;
            auVar40 = *(undefined1 (*) [24])*local_1398;
            lStack_268 = (*local_1398)[3];
            local_13a0 = local_2300 + (int)local_229c;
            auVar41 = *(undefined1 (*) [24])*local_13a0;
            lStack_2c8 = (*local_13a0)[3];
            local_13a8 = (undefined1 (*) [32])
                         (local_22d0 + (long)(int)(iVar49 * local_22c0) * 0x20 +
                         (long)(int)local_229c * 0x20);
            local_1b40 = *(undefined8 *)*local_13a8;
            uStack_1b38 = *(undefined8 *)(*local_13a8 + 8);
            uStack_1b30 = *(undefined8 *)(*local_13a8 + 0x10);
            uStack_1b28 = *(undefined8 *)(*local_13a8 + 0x18);
            local_13b0 = (undefined1 (*) [32])
                         (local_22d8 + (long)(int)(iVar1 * local_22c0) * 0x20 +
                         (long)(int)local_229c * 0x20);
            local_1b80 = *(undefined8 *)*local_13b0;
            uStack_1b78 = *(undefined8 *)(*local_13b0 + 8);
            uStack_1b70 = *(undefined8 *)(*local_13b0 + 0x10);
            uStack_1b68 = *(undefined8 *)(*local_13b0 + 0x18);
            local_13b8 = (undefined1 (*) [32])
                         (local_22e0 + (long)(int)(iVar2 * local_22c0) * 0x20 +
                         (long)(int)local_229c * 0x20);
            local_1bc0 = *(undefined8 *)*local_13b8;
            uStack_1bb8 = *(undefined8 *)(*local_13b8 + 8);
            uStack_1bb0 = *(undefined8 *)(*local_13b8 + 0x10);
            uStack_1ba8 = *(undefined8 *)(*local_13b8 + 0x18);
            local_13c0 = local_2348 + (int)local_229c;
            auVar42 = *(undefined1 (*) [24])*local_13c0;
            lStack_1aa8 = (*local_13c0)[3];
            local_13c8 = local_2350 + (int)local_229c;
            local_1b00 = (*local_13c8)[0];
            lStack_1af8 = (*local_13c8)[1];
            lStack_1af0 = (*local_13c8)[2];
            lStack_1ae8 = (*local_13c8)[3];
            local_2880._0_8_ = auVar34._0_8_;
            local_18e0 = local_2880._0_8_;
            local_2880._8_8_ = auVar34._8_8_;
            uStack_18d8 = local_2880._8_8_;
            local_2880._16_8_ = auVar34._16_8_;
            uStack_18d0 = local_2880._16_8_;
            local_1900 = local_2380;
            uStack_18f8 = uStack_2378;
            uStack_18f0 = uStack_2370;
            uStack_18e8 = uStack_2368;
            auVar27._8_8_ = uStack_2378;
            auVar27._0_8_ = local_2380;
            auVar27._16_8_ = uStack_2370;
            auVar27._24_8_ = uStack_2368;
            auVar13 = vpsubsb_avx2((undefined1  [32])*local_1368,auVar27);
            local_2680 = auVar38._0_8_;
            local_1920 = local_2680;
            lStack_2678 = auVar38._8_8_;
            uStack_1918 = lStack_2678;
            lStack_2670 = auVar38._16_8_;
            uStack_1910 = lStack_2670;
            uStack_1930 = auStack_2390._0_8_;
            uStack_1928 = auStack_2390._8_8_;
            auVar26._16_8_ = auStack_2390._0_8_;
            auVar26._0_16_ = local_23a0;
            auVar26._24_8_ = auStack_2390._8_8_;
            auVar11 = vpsubsb_avx2((undefined1  [32])*local_1388,auVar26);
            local_26c0 = auVar13._0_8_;
            local_10e0 = local_26c0;
            uStack_26b8 = auVar13._8_8_;
            uStack_10d8 = uStack_26b8;
            uStack_26b0 = auVar13._16_8_;
            uStack_10d0 = uStack_26b0;
            uStack_26a8 = auVar13._24_8_;
            uStack_10c8 = uStack_26a8;
            local_26a0 = auVar11._0_8_;
            local_1100 = local_26a0;
            uStack_2698 = auVar11._8_8_;
            uStack_10f8 = uStack_2698;
            uStack_2690 = auVar11._16_8_;
            uStack_10f0 = uStack_2690;
            uStack_2688 = auVar11._24_8_;
            uStack_10e8 = uStack_2688;
            auVar12 = vpcmpgtb_avx2(auVar13,auVar11);
            local_d60 = local_26c0;
            uStack_d58 = uStack_26b8;
            uStack_d50 = uStack_26b0;
            uStack_d48 = uStack_26a8;
            local_d80 = local_26a0;
            uStack_d78 = uStack_2698;
            uStack_d70 = uStack_2690;
            uStack_d68 = uStack_2688;
            auVar10 = vpmaxsb_avx2(auVar13,auVar11);
            local_26e0 = auVar39._0_8_;
            local_220 = local_26e0;
            lStack_26d8 = auVar39._8_8_;
            uStack_218 = lStack_26d8;
            lStack_26d0 = auVar39._16_8_;
            uStack_210 = lStack_26d0;
            local_28a0._0_8_ = auVar35._0_8_;
            local_240 = local_28a0._0_8_;
            local_28a0._8_8_ = auVar35._8_8_;
            uStack_238 = local_28a0._8_8_;
            local_28a0._16_8_ = auVar35._16_8_;
            uStack_230 = local_28a0._16_8_;
            local_2a40 = auVar12._0_8_;
            local_260 = local_2a40;
            uStack_2a38 = auVar12._8_8_;
            uStack_258 = uStack_2a38;
            uStack_2a30 = auVar12._16_8_;
            uStack_250 = uStack_2a30;
            uStack_2a28 = auVar12._24_8_;
            uStack_248 = uStack_2a28;
            auVar7 = vpblendvb_avx2((undefined1  [32])*local_1390,(undefined1  [32])*local_1370,
                                    auVar12);
            local_2700 = auVar40._0_8_;
            local_280 = local_2700;
            lStack_26f8 = auVar40._8_8_;
            uStack_278 = lStack_26f8;
            lStack_26f0 = auVar40._16_8_;
            uStack_270 = lStack_26f0;
            local_28c0._0_8_ = auVar36._0_8_;
            local_2a0 = local_28c0._0_8_;
            local_28c0._8_8_ = auVar36._8_8_;
            uStack_298 = local_28c0._8_8_;
            local_28c0._16_8_ = auVar36._16_8_;
            uStack_290 = local_28c0._16_8_;
            local_2c0 = local_2a40;
            uStack_2b8 = uStack_2a38;
            uStack_2b0 = uStack_2a30;
            uStack_2a8 = uStack_2a28;
            auVar8 = vpblendvb_avx2((undefined1  [32])*local_1398,(undefined1  [32])*local_1378,
                                    auVar12);
            local_2720 = auVar41._0_8_;
            local_2e0 = local_2720;
            lStack_2718 = auVar41._8_8_;
            uStack_2d8 = lStack_2718;
            lStack_2710 = auVar41._16_8_;
            uStack_2d0 = lStack_2710;
            local_28e0._0_8_ = auVar37._0_8_;
            local_300 = local_28e0._0_8_;
            local_28e0._8_8_ = auVar37._8_8_;
            uStack_2f8 = local_28e0._8_8_;
            local_28e0._16_8_ = auVar37._16_8_;
            uStack_2f0 = local_28e0._16_8_;
            local_320 = local_2a40;
            uStack_318 = uStack_2a38;
            uStack_310 = uStack_2a30;
            uStack_308 = uStack_2a28;
            auVar12 = vpblendvb_avx2((undefined1  [32])*local_13a0,(undefined1  [32])*local_1380,
                                     auVar12);
            local_2720 = auVar12._0_8_;
            local_1a60 = local_2720;
            lStack_2718 = auVar12._8_8_;
            uStack_1a58 = lStack_2718;
            lStack_2710 = auVar12._16_8_;
            uStack_1a50 = lStack_2710;
            lStack_2708 = auVar12._24_8_;
            uStack_1a48 = lStack_2708;
            local_1a80 = local_2400;
            uStack_1a78 = uStack_23f8;
            uStack_1a70 = uStack_23f0;
            uStack_1a68 = uStack_23e8;
            auVar23._8_8_ = uStack_23f8;
            auVar23._0_8_ = local_2400;
            auVar23._16_8_ = uStack_23f0;
            auVar23._24_8_ = uStack_23e8;
            alVar5 = (__m256i)vpaddsb_avx2(auVar12,auVar23);
            local_1aa0 = local_2740;
            uStack_1a98 = uStack_2738;
            uStack_1a90 = uStack_2730;
            uStack_1a88 = uStack_2728;
            local_2a80 = auVar42._0_8_;
            local_1ac0 = local_2a80;
            uStack_2a78 = auVar42._8_8_;
            uStack_1ab8 = uStack_2a78;
            uStack_2a70 = auVar42._16_8_;
            uStack_1ab0 = uStack_2a70;
            auVar12 = vpaddsb_avx2(_local_2740,(undefined1  [32])*local_13c0);
            local_1120 = local_27c0._0_8_;
            uStack_1118 = local_27c0._8_8_;
            uStack_1110 = local_27c0._16_8_;
            uStack_1108 = local_27c0._24_8_;
            local_2a80 = auVar12._0_8_;
            local_1140 = local_2a80;
            uStack_2a78 = auVar12._8_8_;
            uStack_1138 = uStack_2a78;
            uStack_2a70 = auVar12._16_8_;
            uStack_1130 = uStack_2a70;
            uStack_2a68 = auVar12._24_8_;
            uStack_1128 = uStack_2a68;
            local_120 = vpcmpgtb_avx2(local_27c0,auVar12);
            local_2120 = local_27c0._0_8_;
            uStack_2118 = local_27c0._8_8_;
            uStack_2110 = local_27c0._16_8_;
            uStack_2108 = local_27c0._24_8_;
            local_2140 = local_2a80;
            uStack_2138 = uStack_2a78;
            uStack_2130 = uStack_2a70;
            uStack_2128 = uStack_2a68;
            local_140 = vpcmpeqb_avx2(local_27c0,auVar12);
            auVar13 = vpor_avx2(local_120,local_140);
            local_da0 = local_27c0._0_8_;
            uStack_d98 = local_27c0._8_8_;
            uStack_d90 = local_27c0._16_8_;
            uStack_d88 = local_27c0._24_8_;
            local_dc0 = local_2a80;
            uStack_db8 = uStack_2a78;
            uStack_db0 = uStack_2a70;
            uStack_da8 = uStack_2a68;
            local_27c0 = vpmaxsb_avx2(local_27c0,auVar12);
            local_340 = local_2760._0_8_;
            uStack_338 = local_2760._8_8_;
            uStack_330 = local_2760._16_8_;
            uStack_328 = local_2760._24_8_;
            local_360 = local_2820._0_8_;
            uStack_358 = local_2820._8_8_;
            uStack_350 = local_2820._16_8_;
            uStack_348 = local_2820._24_8_;
            local_2a40 = auVar13._0_8_;
            local_380 = local_2a40;
            uStack_2a38 = auVar13._8_8_;
            uStack_378 = uStack_2a38;
            uStack_2a30 = auVar13._16_8_;
            uStack_370 = uStack_2a30;
            uStack_2a28 = auVar13._24_8_;
            uStack_368 = uStack_2a28;
            local_2820 = vpblendvb_avx2(local_2760,local_2820,auVar13);
            local_3a0 = local_2780._0_8_;
            uStack_398 = local_2780._8_8_;
            uStack_390 = local_2780._16_8_;
            uStack_388 = local_2780._24_8_;
            local_3c0 = local_2840._0_8_;
            uStack_3b8 = local_2840._8_8_;
            uStack_3b0 = local_2840._16_8_;
            uStack_3a8 = local_2840._24_8_;
            local_3e0 = local_2a40;
            uStack_3d8 = uStack_2a38;
            uStack_3d0 = uStack_2a30;
            uStack_3c8 = uStack_2a28;
            local_2840 = vpblendvb_avx2(local_2780,local_2840,auVar13);
            local_1ae0 = local_27a0._0_8_;
            uStack_1ad8 = local_27a0._8_8_;
            uStack_1ad0 = local_27a0._16_8_;
            uStack_1ac8 = local_27a0._24_8_;
            local_400 = vpaddsb_avx2(local_27a0,(undefined1  [32])*local_13c8);
            local_420 = local_2860._0_8_;
            uStack_418 = local_2860._8_8_;
            uStack_410 = local_2860._16_8_;
            uStack_408 = local_2860._24_8_;
            local_440 = local_2a40;
            uStack_438 = uStack_2a38;
            uStack_430 = uStack_2a30;
            uStack_428 = uStack_2a28;
            local_2860 = vpblendvb_avx2(local_400,local_2860,auVar13);
            local_1b20 = local_2900[0];
            lStack_1b18 = local_2900[1];
            lStack_1b10 = local_2900[2];
            lStack_1b08 = local_2900[3];
            auVar12 = vpaddsb_avx2((undefined1  [32])local_2900,*local_13a8);
            local_1b60 = local_2920[0];
            lStack_1b58 = local_2920[1];
            lStack_1b50 = local_2920[2];
            lStack_1b48 = local_2920[3];
            auVar13 = vpaddsb_avx2((undefined1  [32])local_2920,*local_13b0);
            local_1ba0 = local_2940[0];
            lStack_1b98 = local_2940[1];
            lStack_1b90 = local_2940[2];
            lStack_1b88 = local_2940[3];
            auVar11 = vpaddsb_avx2((undefined1  [32])local_2940,*local_13b8);
            local_1be0 = local_2960[0];
            lStack_1bd8 = local_2960[1];
            lStack_1bd0 = local_2960[2];
            lStack_1bc8 = local_2960[3];
            local_1c00 = local_2400;
            uStack_1bf8 = uStack_23f8;
            uStack_1bf0 = uStack_23f0;
            uStack_1be8 = uStack_23e8;
            auVar22._8_8_ = uStack_23f8;
            auVar22._0_8_ = local_2400;
            auVar22._16_8_ = uStack_23f0;
            auVar22._24_8_ = uStack_23e8;
            auVar6 = vpaddsb_avx2((undefined1  [32])local_2960,auVar22);
            local_2680 = auVar10._0_8_;
            local_1160 = local_2680;
            lStack_2678 = auVar10._8_8_;
            lStack_1158 = lStack_2678;
            lStack_2670 = auVar10._16_8_;
            lStack_1150 = lStack_2670;
            lStack_2668 = auVar10._24_8_;
            lStack_1148 = lStack_2668;
            local_2900[0] = auVar12._0_8_;
            local_1180 = local_2900[0];
            local_2900[1] = auVar12._8_8_;
            lStack_1178 = local_2900[1];
            local_2900[2] = auVar12._16_8_;
            lStack_1170 = local_2900[2];
            local_2900[3] = auVar12._24_8_;
            lStack_1168 = local_2900[3];
            auVar9 = vpcmpgtb_avx2(auVar10,auVar12);
            local_de0 = local_2680;
            lStack_dd8 = lStack_2678;
            lStack_dd0 = lStack_2670;
            lStack_dc8 = lStack_2668;
            local_e00 = local_2900[0];
            lStack_df8 = local_2900[1];
            lStack_df0 = local_2900[2];
            lStack_de8 = local_2900[3];
            _local_2740 = vpmaxsb_avx2(auVar10,auVar12);
            local_2920[0] = auVar13._0_8_;
            local_460 = local_2920[0];
            local_2920[1] = auVar13._8_8_;
            lStack_458 = local_2920[1];
            local_2920[2] = auVar13._16_8_;
            lStack_450 = local_2920[2];
            local_2920[3] = auVar13._24_8_;
            lStack_448 = local_2920[3];
            local_26e0 = auVar7._0_8_;
            local_480 = local_26e0;
            lStack_26d8 = auVar7._8_8_;
            lStack_478 = lStack_26d8;
            lStack_26d0 = auVar7._16_8_;
            lStack_470 = lStack_26d0;
            lStack_26c8 = auVar7._24_8_;
            lStack_468 = lStack_26c8;
            local_2a40 = auVar9._0_8_;
            local_4a0 = local_2a40;
            uStack_2a38 = auVar9._8_8_;
            uStack_498 = uStack_2a38;
            uStack_2a30 = auVar9._16_8_;
            uStack_490 = uStack_2a30;
            uStack_2a28 = auVar9._24_8_;
            uStack_488 = uStack_2a28;
            local_2760 = vpblendvb_avx2(auVar13,auVar7,auVar9);
            local_2940[0] = auVar11._0_8_;
            local_4c0 = local_2940[0];
            local_2940[1] = auVar11._8_8_;
            lStack_4b8 = local_2940[1];
            local_2940[2] = auVar11._16_8_;
            lStack_4b0 = local_2940[2];
            local_2940[3] = auVar11._24_8_;
            lStack_4a8 = local_2940[3];
            local_2700 = auVar8._0_8_;
            local_4e0 = local_2700;
            lStack_26f8 = auVar8._8_8_;
            lStack_4d8 = lStack_26f8;
            lStack_26f0 = auVar8._16_8_;
            lStack_4d0 = lStack_26f0;
            lStack_26e8 = auVar8._24_8_;
            lStack_4c8 = lStack_26e8;
            local_500 = local_2a40;
            uStack_4f8 = uStack_2a38;
            uStack_4f0 = uStack_2a30;
            uStack_4e8 = uStack_2a28;
            local_2780 = vpblendvb_avx2(auVar11,auVar8,auVar9);
            local_2960[0] = auVar6._0_8_;
            local_520 = local_2960[0];
            local_2960[1] = auVar6._8_8_;
            lStack_518 = local_2960[1];
            local_2960[2] = auVar6._16_8_;
            lStack_510 = local_2960[2];
            local_2960[3] = auVar6._24_8_;
            lStack_508 = local_2960[3];
            local_2720 = alVar5[0];
            local_540 = local_2720;
            lStack_2718 = alVar5[1];
            lStack_538 = lStack_2718;
            lStack_2710 = alVar5[2];
            lStack_530 = lStack_2710;
            lStack_2708 = alVar5[3];
            lStack_528 = lStack_2708;
            local_560 = local_2a40;
            uStack_558 = uStack_2a38;
            uStack_550 = uStack_2a30;
            uStack_548 = uStack_2a28;
            local_27a0 = vpblendvb_avx2(auVar6,(undefined1  [32])alVar5,auVar9);
            local_1508 = local_22e8 + (int)local_229c;
            local_1540 = local_2680;
            lStack_1538 = lStack_2678;
            lStack_1530 = lStack_2670;
            lStack_1528 = lStack_2668;
            (*local_1508)[0] = local_2680;
            (*local_1508)[1] = lStack_2678;
            (*local_1508)[2] = lStack_2670;
            (*local_1508)[3] = lStack_2668;
            local_1548 = local_22f0 + (int)local_229c;
            local_1580 = local_26e0;
            lStack_1578 = lStack_26d8;
            lStack_1570 = lStack_26d0;
            lStack_1568 = lStack_26c8;
            (*local_1548)[0] = local_26e0;
            (*local_1548)[1] = lStack_26d8;
            (*local_1548)[2] = lStack_26d0;
            (*local_1548)[3] = lStack_26c8;
            local_1588 = local_22f8 + (int)local_229c;
            local_15c0 = local_2700;
            lStack_15b8 = lStack_26f8;
            lStack_15b0 = lStack_26f0;
            lStack_15a8 = lStack_26e8;
            (*local_1588)[0] = local_2700;
            (*local_1588)[1] = lStack_26f8;
            (*local_1588)[2] = lStack_26f0;
            (*local_1588)[3] = lStack_26e8;
            local_15c8 = local_2300 + (int)local_229c;
            local_1600 = local_2720;
            lStack_15f8 = lStack_2718;
            lStack_15f0 = lStack_2710;
            lStack_15e8 = lStack_2708;
            (*local_15c8)[0] = local_2720;
            (*local_15c8)[1] = lStack_2718;
            (*local_15c8)[2] = lStack_2710;
            (*local_15c8)[3] = lStack_2708;
            local_1608 = local_2308 + (int)local_229c;
            local_1640 = local_2900[0];
            lStack_1638 = local_2900[1];
            lStack_1630 = local_2900[2];
            lStack_1628 = local_2900[3];
            (*local_1608)[0] = local_2900[0];
            (*local_1608)[1] = local_2900[1];
            (*local_1608)[2] = local_2900[2];
            (*local_1608)[3] = local_2900[3];
            local_1648 = local_2310 + (int)local_229c;
            local_1680 = local_2920[0];
            lStack_1678 = local_2920[1];
            lStack_1670 = local_2920[2];
            lStack_1668 = local_2920[3];
            (*local_1648)[0] = local_2920[0];
            (*local_1648)[1] = local_2920[1];
            (*local_1648)[2] = local_2920[2];
            (*local_1648)[3] = local_2920[3];
            local_1688 = local_2318 + (int)local_229c;
            local_16c0 = local_2940[0];
            lStack_16b8 = local_2940[1];
            lStack_16b0 = local_2940[2];
            lStack_16a8 = local_2940[3];
            (*local_1688)[0] = local_2940[0];
            (*local_1688)[1] = local_2940[1];
            (*local_1688)[2] = local_2940[2];
            (*local_1688)[3] = local_2940[3];
            local_16c8 = local_2320 + (int)local_229c;
            local_1700 = local_2960[0];
            lStack_16f8 = local_2960[1];
            lStack_16f0 = local_2960[2];
            lStack_16e8 = local_2960[3];
            (*local_16c8)[0] = local_2960[0];
            (*local_16c8)[1] = local_2960[1];
            (*local_16c8)[2] = local_2960[2];
            (*local_16c8)[3] = local_2960[3];
            local_229c = local_229c + 1;
            local_2960 = alVar18;
            local_2940 = alVar17;
            local_2920 = alVar16;
            local_2900 = alVar15;
            local_1940 = local_23a0;
          }
          auVar13 = vperm2i128_avx2((undefined1  [32])alVar5,_local_2740,0x28);
          auVar12 = vpalignr_avx2(_local_2740,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,local_2760,0x28);
          local_2760 = vpalignr_avx2(local_2760,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,local_2780,0x28);
          local_2780 = vpalignr_avx2(local_2780,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,local_27a0,0x28);
          local_27a0 = vpalignr_avx2(local_27a0,auVar13,0xf);
          stack0xffffffffffffd8c1 = auVar12._1_31_;
          local_2740[0] = local_2358[(long)local_22a0 + 1];
          local_13d0 = local_2348;
          auVar34 = *(undefined1 (*) [24])*local_2348;
          lStack_1c28 = (*local_2348)[3];
          local_13d8 = local_2350;
          local_1c80 = (*local_2350)[0];
          lStack_1c78 = (*local_2350)[1];
          lStack_1c70 = (*local_2350)[2];
          lStack_1c68 = (*local_2350)[3];
          local_1c20 = local_2740;
          uStack_2738 = auVar12._8_8_;
          uStack_1c18 = uStack_2738;
          uStack_2730 = auVar12._16_8_;
          uStack_1c10 = uStack_2730;
          uStack_2728 = auVar12._24_8_;
          uStack_1c08 = uStack_2728;
          local_2a80 = auVar34._0_8_;
          local_1c40 = local_2a80;
          uStack_2a78 = auVar34._8_8_;
          uStack_1c38 = uStack_2a78;
          uStack_2a70 = auVar34._16_8_;
          uStack_1c30 = uStack_2a70;
          auVar21._8_8_ = uStack_2738;
          auVar21._0_8_ = local_2740;
          auVar21._16_8_ = uStack_2730;
          auVar21._24_8_ = uStack_2728;
          auVar12 = vpaddsb_avx2(auVar21,(undefined1  [32])*local_2348);
          local_2a80 = auVar12._0_8_;
          local_11a0 = local_2a80;
          uStack_2a78 = auVar12._8_8_;
          uStack_1198 = uStack_2a78;
          uStack_2a70 = auVar12._16_8_;
          uStack_1190 = uStack_2a70;
          uStack_2a68 = auVar12._24_8_;
          uStack_1188 = uStack_2a68;
          local_11c0 = local_27c0._0_8_;
          uStack_11b8 = local_27c0._8_8_;
          uStack_11b0 = local_27c0._16_8_;
          uStack_11a8 = local_27c0._24_8_;
          local_160 = vpcmpgtb_avx2(auVar12,local_27c0);
          local_2160 = local_2a80;
          uStack_2158 = uStack_2a78;
          uStack_2150 = uStack_2a70;
          uStack_2148 = uStack_2a68;
          local_2180 = local_27c0._0_8_;
          uStack_2178 = local_27c0._8_8_;
          uStack_2170 = local_27c0._16_8_;
          uStack_2168 = local_27c0._24_8_;
          local_180 = vpcmpeqb_avx2(auVar12,local_27c0);
          auVar13 = vpor_avx2(local_160,local_180);
          local_e20 = local_27c0._0_8_;
          uStack_e18 = local_27c0._8_8_;
          uStack_e10 = local_27c0._16_8_;
          uStack_e08 = local_27c0._24_8_;
          local_e40 = local_2a80;
          uStack_e38 = uStack_2a78;
          uStack_e30 = uStack_2a70;
          uStack_e28 = uStack_2a68;
          local_27c0 = vpmaxsb_avx2(local_27c0,auVar12);
          local_580 = local_2820._0_8_;
          uStack_578 = local_2820._8_8_;
          uStack_570 = local_2820._16_8_;
          uStack_568 = local_2820._24_8_;
          local_5a0 = local_2760._0_8_;
          uStack_598 = local_2760._8_8_;
          uStack_590 = local_2760._16_8_;
          uStack_588 = local_2760._24_8_;
          local_2a40 = auVar13._0_8_;
          local_5c0 = local_2a40;
          uStack_2a38 = auVar13._8_8_;
          uStack_5b8 = uStack_2a38;
          uStack_2a30 = auVar13._16_8_;
          uStack_5b0 = uStack_2a30;
          uStack_2a28 = auVar13._24_8_;
          uStack_5a8 = uStack_2a28;
          local_2820 = vpblendvb_avx2(local_2820,local_2760,auVar13);
          local_5e0 = local_2840._0_8_;
          uStack_5d8 = local_2840._8_8_;
          uStack_5d0 = local_2840._16_8_;
          uStack_5c8 = local_2840._24_8_;
          local_600 = local_2780._0_8_;
          uStack_5f8 = local_2780._8_8_;
          uStack_5f0 = local_2780._16_8_;
          uStack_5e8 = local_2780._24_8_;
          local_620 = local_2a40;
          uStack_618 = uStack_2a38;
          uStack_610 = uStack_2a30;
          uStack_608 = uStack_2a28;
          local_2840 = vpblendvb_avx2(local_2840,local_2780,auVar13);
          local_640 = local_2860._0_8_;
          uStack_638 = local_2860._8_8_;
          uStack_630 = local_2860._16_8_;
          uStack_628 = local_2860._24_8_;
          local_1c60 = local_27a0._0_8_;
          uStack_1c58 = local_27a0._8_8_;
          uStack_1c50 = local_27a0._16_8_;
          uStack_1c48 = local_27a0._24_8_;
          local_660 = vpaddsb_avx2(local_27a0,(undefined1  [32])*local_2350);
          local_680 = local_2a40;
          uStack_678 = uStack_2a38;
          uStack_670 = uStack_2a30;
          uStack_668 = uStack_2a28;
          local_2860 = vpblendvb_avx2(local_2860,local_660,auVar13);
          auVar12 = local_660;
          for (local_229c = 0; (int)local_229c < local_22bc + -2; local_229c = local_229c + 1) {
            auVar13 = vperm2i128_avx2(auVar12,local_27c0,0x28);
            auVar12 = vpalignr_avx2(local_27c0,auVar13,0xf);
            auVar11 = vperm2i128_avx2(auVar13,local_2820,0x28);
            auVar13 = vpalignr_avx2(local_2820,auVar11,0xf);
            auVar6 = vperm2i128_avx2(auVar11,local_2840,0x28);
            auVar11 = vpalignr_avx2(local_2840,auVar6,0xf);
            auVar6 = vperm2i128_avx2(auVar6,local_2860,0x28);
            auVar6 = vpalignr_avx2(local_2860,auVar6,0xf);
            local_2ac0 = auVar12._0_8_;
            local_1ca0 = local_2ac0;
            uStack_2ab8 = auVar12._8_8_;
            uStack_1c98 = uStack_2ab8;
            uStack_2ab0 = auVar12._16_8_;
            uStack_1c90 = uStack_2ab0;
            uStack_2aa8 = auVar12._24_8_;
            uStack_1c88 = uStack_2aa8;
            local_1cc0 = local_2580._0_8_;
            uStack_1cb8 = local_2580._8_8_;
            uStack_1cb0 = local_2580._16_8_;
            uStack_1ca8 = local_2580._24_8_;
            auVar12 = vpaddsb_avx2(auVar12,local_2580);
            local_2ac0 = auVar12._0_8_;
            local_11e0 = local_2ac0;
            uStack_2ab8 = auVar12._8_8_;
            uStack_11d8 = uStack_2ab8;
            uStack_2ab0 = auVar12._16_8_;
            uStack_11d0 = uStack_2ab0;
            uStack_2aa8 = auVar12._24_8_;
            uStack_11c8 = uStack_2aa8;
            local_1200 = local_27c0._0_8_;
            uStack_11f8 = local_27c0._8_8_;
            uStack_11f0 = local_27c0._16_8_;
            uStack_11e8 = local_27c0._24_8_;
            local_1a0 = vpcmpgtb_avx2(auVar12,local_27c0);
            local_21a0 = local_2ac0;
            uStack_2198 = uStack_2ab8;
            uStack_2190 = uStack_2ab0;
            uStack_2188 = uStack_2aa8;
            local_21c0 = local_27c0._0_8_;
            uStack_21b8 = local_27c0._8_8_;
            uStack_21b0 = local_27c0._16_8_;
            uStack_21a8 = local_27c0._24_8_;
            local_1c0 = vpcmpeqb_avx2(auVar12,local_27c0);
            auVar7 = vpor_avx2(local_1a0,local_1c0);
            local_e60 = local_27c0._0_8_;
            uStack_e58 = local_27c0._8_8_;
            uStack_e50 = local_27c0._16_8_;
            uStack_e48 = local_27c0._24_8_;
            local_e80 = local_2ac0;
            uStack_e78 = uStack_2ab8;
            uStack_e70 = uStack_2ab0;
            uStack_e68 = uStack_2aa8;
            local_27c0 = vpmaxsb_avx2(local_27c0,auVar12);
            local_6a0 = local_2820._0_8_;
            uStack_698 = local_2820._8_8_;
            uStack_690 = local_2820._16_8_;
            uStack_688 = local_2820._24_8_;
            local_2ae0 = auVar13._0_8_;
            local_6c0 = local_2ae0;
            uStack_2ad8 = auVar13._8_8_;
            uStack_6b8 = uStack_2ad8;
            uStack_2ad0 = auVar13._16_8_;
            uStack_6b0 = uStack_2ad0;
            uStack_2ac8 = auVar13._24_8_;
            uStack_6a8 = uStack_2ac8;
            local_2a40 = auVar7._0_8_;
            local_6e0 = local_2a40;
            uStack_2a38 = auVar7._8_8_;
            uStack_6d8 = uStack_2a38;
            uStack_2a30 = auVar7._16_8_;
            uStack_6d0 = uStack_2a30;
            uStack_2a28 = auVar7._24_8_;
            uStack_6c8 = uStack_2a28;
            local_2820 = vpblendvb_avx2(local_2820,auVar13,auVar7);
            local_700 = local_2840._0_8_;
            uStack_6f8 = local_2840._8_8_;
            uStack_6f0 = local_2840._16_8_;
            uStack_6e8 = local_2840._24_8_;
            local_2b00 = auVar11._0_8_;
            local_720 = local_2b00;
            uStack_2af8 = auVar11._8_8_;
            uStack_718 = uStack_2af8;
            uStack_2af0 = auVar11._16_8_;
            uStack_710 = uStack_2af0;
            uStack_2ae8 = auVar11._24_8_;
            uStack_708 = uStack_2ae8;
            local_740 = local_2a40;
            uStack_738 = uStack_2a38;
            uStack_730 = uStack_2a30;
            uStack_728 = uStack_2a28;
            local_2840 = vpblendvb_avx2(local_2840,auVar11,auVar7);
            local_760 = local_2860._0_8_;
            uStack_758 = local_2860._8_8_;
            uStack_750 = local_2860._16_8_;
            uStack_748 = local_2860._24_8_;
            local_2b20 = auVar6._0_8_;
            local_1ce0 = local_2b20;
            uStack_2b18 = auVar6._8_8_;
            uStack_1cd8 = uStack_2b18;
            uStack_2b10 = auVar6._16_8_;
            uStack_1cd0 = uStack_2b10;
            uStack_2b08 = auVar6._24_8_;
            uStack_1cc8 = uStack_2b08;
            local_1d00 = local_25a0._0_8_;
            uStack_1cf8 = local_25a0._8_8_;
            uStack_1cf0 = local_25a0._16_8_;
            uStack_1ce8 = local_25a0._24_8_;
            auVar12 = vpaddsb_avx2(auVar6,local_25a0);
            local_7a0 = local_2a40;
            uStack_798 = uStack_2a38;
            uStack_790 = uStack_2a30;
            uStack_788 = uStack_2a28;
            local_2860 = vpblendvb_avx2(local_2860,auVar12,auVar7);
            local_780 = auVar12;
          }
          auVar13 = vperm2i128_avx2(auVar12,local_27c0,0x28);
          auVar12 = vpalignr_avx2(local_27c0,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,local_2820,0x28);
          local_2820 = vpalignr_avx2(local_2820,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,local_2840,0x28);
          local_2840 = vpalignr_avx2(local_2840,auVar13,0xf);
          auVar13 = vperm2i128_avx2(auVar13,local_2860,0x28);
          local_2860 = vpalignr_avx2(local_2860,auVar13,0xf);
          local_27c0._0_8_ = auVar12._0_8_;
          local_1d20 = local_27c0._0_8_;
          local_27c0._8_8_ = auVar12._8_8_;
          uStack_1d18 = local_27c0._8_8_;
          local_27c0._16_8_ = auVar12._16_8_;
          uStack_1d10 = local_27c0._16_8_;
          local_27c0._24_8_ = auVar12._24_8_;
          uStack_1d08 = local_27c0._24_8_;
          local_1d40 = local_2560;
          uStack_1d38 = uStack_2558;
          uStack_1d30 = uStack_2550;
          uStack_1d28 = uStack_2548;
          auVar20._8_8_ = uStack_2558;
          auVar20._0_8_ = local_2560;
          auVar20._16_8_ = uStack_2550;
          auVar20._24_8_ = uStack_2548;
          local_27c0 = vpaddsb_avx2(auVar12,auVar20);
          local_1220 = local_27c0._0_8_;
          uStack_1218 = local_27c0._8_8_;
          uStack_1210 = local_27c0._16_8_;
          uStack_1208 = local_27c0._24_8_;
          local_1240 = local_2740;
          uStack_1238 = uStack_2738;
          uStack_1230 = uStack_2730;
          uStack_1228 = uStack_2728;
          auVar32._8_8_ = uStack_2738;
          auVar32._0_8_ = local_2740;
          auVar32._16_8_ = uStack_2730;
          auVar32._24_8_ = uStack_2728;
          auVar12 = vpcmpgtb_avx2(local_27c0,auVar32);
          local_ea0 = local_27c0._0_8_;
          uStack_e98 = local_27c0._8_8_;
          uStack_e90 = local_27c0._16_8_;
          uStack_e88 = local_27c0._24_8_;
          local_ec0 = local_2740;
          uStack_eb8 = uStack_2738;
          uStack_eb0 = uStack_2730;
          uStack_ea8 = uStack_2728;
          auVar33._8_8_ = uStack_2738;
          auVar33._0_8_ = local_2740;
          auVar33._16_8_ = uStack_2730;
          auVar33._24_8_ = uStack_2728;
          local_2880 = vpmaxsb_avx2(local_27c0,auVar33);
          local_7c0 = local_2760._0_8_;
          uStack_7b8 = local_2760._8_8_;
          uStack_7b0 = local_2760._16_8_;
          uStack_7a8 = local_2760._24_8_;
          local_7e0 = local_2820._0_8_;
          uStack_7d8 = local_2820._8_8_;
          uStack_7d0 = local_2820._16_8_;
          uStack_7c8 = local_2820._24_8_;
          local_2a40 = auVar12._0_8_;
          local_800 = local_2a40;
          uStack_2a38 = auVar12._8_8_;
          uStack_7f8 = uStack_2a38;
          uStack_2a30 = auVar12._16_8_;
          uStack_7f0 = uStack_2a30;
          uStack_2a28 = auVar12._24_8_;
          uStack_7e8 = uStack_2a28;
          local_28a0 = vpblendvb_avx2(local_2760,local_2820,auVar12);
          local_820 = local_2780._0_8_;
          uStack_818 = local_2780._8_8_;
          uStack_810 = local_2780._16_8_;
          uStack_808 = local_2780._24_8_;
          local_840 = local_2840._0_8_;
          uStack_838 = local_2840._8_8_;
          uStack_830 = local_2840._16_8_;
          uStack_828 = local_2840._24_8_;
          local_860 = local_2a40;
          uStack_858 = uStack_2a38;
          uStack_850 = uStack_2a30;
          uStack_848 = uStack_2a28;
          local_28c0 = vpblendvb_avx2(local_2780,local_2840,auVar12);
          local_880 = local_27a0._0_8_;
          uStack_878 = local_27a0._8_8_;
          uStack_870 = local_27a0._16_8_;
          uStack_868 = local_27a0._24_8_;
          local_8a0 = local_2860._0_8_;
          uStack_898 = local_2860._8_8_;
          uStack_890 = local_2860._16_8_;
          uStack_888 = local_2860._24_8_;
          local_8c0 = local_2a40;
          uStack_8b8 = uStack_2a38;
          uStack_8b0 = uStack_2a30;
          uStack_8a8 = uStack_2a28;
          local_28e0 = vpblendvb_avx2(local_27a0,local_2860,auVar12);
          local_229c = 0;
          while( true ) {
            if ((int)local_22c0 <= (int)local_229c) break;
            local_13e0 = local_2308 + (int)local_229c;
            auVar34 = *(undefined1 (*) [24])*local_13e0;
            lStack_21e8 = (*local_13e0)[3];
            local_13e8 = local_2310 + (int)local_229c;
            auVar35 = *(undefined1 (*) [24])*local_13e8;
            lStack_a68 = (*local_13e8)[3];
            local_13f0 = local_2318 + (int)local_229c;
            auVar36 = *(undefined1 (*) [24])*local_13f0;
            lStack_b28 = (*local_13f0)[3];
            local_13f8 = local_2320 + (int)local_229c;
            auVar37 = *(undefined1 (*) [24])*local_13f8;
            lStack_be8 = (*local_13f8)[3];
            local_1400 = local_22e8 + (int)local_229c;
            auVar38 = *(undefined1 (*) [24])*local_1400;
            lStack_f28 = (*local_1400)[3];
            local_1408 = local_22f0 + (int)local_229c;
            auVar39 = *(undefined1 (*) [24])*local_1408;
            lStack_9e8 = (*local_1408)[3];
            local_1410 = local_22f8 + (int)local_229c;
            auVar40 = *(undefined1 (*) [24])*local_1410;
            lStack_aa8 = (*local_1410)[3];
            local_1418 = local_2300 + (int)local_229c;
            auVar41 = *(undefined1 (*) [24])*local_1418;
            lStack_b68 = (*local_1418)[3];
            local_1960 = local_2880._0_8_;
            uStack_1958 = local_2880._8_8_;
            uStack_1950 = local_2880._16_8_;
            uStack_1948 = local_2880._24_8_;
            local_1980 = local_2380;
            uStack_1978 = uStack_2378;
            uStack_1970 = uStack_2370;
            uStack_1968 = uStack_2368;
            auVar25._8_8_ = uStack_2378;
            auVar25._0_8_ = local_2380;
            auVar25._16_8_ = uStack_2370;
            auVar25._24_8_ = uStack_2368;
            auVar12 = vpsubsb_avx2(local_2880,auVar25);
            local_19a0 = local_27c0._0_8_;
            uStack_1998 = local_27c0._8_8_;
            uStack_1990 = local_27c0._16_8_;
            uStack_1988 = local_27c0._24_8_;
            uStack_19b0 = auStack_2390._0_8_;
            uStack_19a8 = auStack_2390._8_8_;
            auVar24._16_8_ = auStack_2390._0_8_;
            auVar24._0_16_ = local_23a0;
            auVar24._24_8_ = auStack_2390._8_8_;
            auVar13 = vpsubsb_avx2(local_27c0,auVar24);
            local_2800 = auVar12._0_8_;
            local_ee0 = local_2800;
            uStack_27f8 = auVar12._8_8_;
            uStack_ed8 = uStack_27f8;
            uStack_27f0 = auVar12._16_8_;
            uStack_ed0 = uStack_27f0;
            uStack_27e8 = auVar12._24_8_;
            uStack_ec8 = uStack_27e8;
            local_27e0 = auVar13._0_8_;
            local_f00 = local_27e0;
            uStack_27d8 = auVar13._8_8_;
            uStack_ef8 = uStack_27d8;
            uStack_27d0 = auVar13._16_8_;
            uStack_ef0 = uStack_27d0;
            uStack_27c8 = auVar13._24_8_;
            uStack_ee8 = uStack_27c8;
            local_27c0 = vpmaxsb_avx2(auVar12,auVar13);
            local_1260 = local_2800;
            uStack_1258 = uStack_27f8;
            uStack_1250 = uStack_27f0;
            uStack_1248 = uStack_27e8;
            local_1280 = local_27e0;
            uStack_1278 = uStack_27d8;
            uStack_1270 = uStack_27d0;
            uStack_1268 = uStack_27c8;
            auVar12 = vpcmpgtb_avx2(auVar12,auVar13);
            local_8e0 = local_2820._0_8_;
            uStack_8d8 = local_2820._8_8_;
            uStack_8d0 = local_2820._16_8_;
            uStack_8c8 = local_2820._24_8_;
            local_900 = local_28a0._0_8_;
            uStack_8f8 = local_28a0._8_8_;
            uStack_8f0 = local_28a0._16_8_;
            uStack_8e8 = local_28a0._24_8_;
            local_2a40 = auVar12._0_8_;
            local_920 = local_2a40;
            uStack_2a38 = auVar12._8_8_;
            uStack_918 = uStack_2a38;
            uStack_2a30 = auVar12._16_8_;
            uStack_910 = uStack_2a30;
            uStack_2a28 = auVar12._24_8_;
            uStack_908 = uStack_2a28;
            local_2820 = vpblendvb_avx2(local_2820,local_28a0,auVar12);
            local_940 = local_2840._0_8_;
            uStack_938 = local_2840._8_8_;
            uStack_930 = local_2840._16_8_;
            uStack_928 = local_2840._24_8_;
            local_960 = local_28c0._0_8_;
            uStack_958 = local_28c0._8_8_;
            uStack_950 = local_28c0._16_8_;
            uStack_948 = local_28c0._24_8_;
            local_980 = local_2a40;
            uStack_978 = uStack_2a38;
            uStack_970 = uStack_2a30;
            uStack_968 = uStack_2a28;
            local_2840 = vpblendvb_avx2(local_2840,local_28c0,auVar12);
            local_9a0 = local_2860._0_8_;
            uStack_998 = local_2860._8_8_;
            uStack_990 = local_2860._16_8_;
            uStack_988 = local_2860._24_8_;
            local_9c0 = local_28e0._0_8_;
            uStack_9b8 = local_28e0._8_8_;
            uStack_9b0 = local_28e0._16_8_;
            uStack_9a8 = local_28e0._24_8_;
            local_9e0 = local_2a40;
            uStack_9d8 = uStack_2a38;
            uStack_9d0 = uStack_2a30;
            uStack_9c8 = uStack_2a28;
            auVar12 = vpblendvb_avx2(local_2860,local_28e0,auVar12);
            local_2860._0_8_ = auVar12._0_8_;
            local_1d60 = local_2860._0_8_;
            local_2860._8_8_ = auVar12._8_8_;
            uStack_1d58 = local_2860._8_8_;
            local_2860._16_8_ = auVar12._16_8_;
            uStack_1d50 = local_2860._16_8_;
            local_2860._24_8_ = auVar12._24_8_;
            uStack_1d48 = local_2860._24_8_;
            local_1d80 = local_2400;
            uStack_1d78 = uStack_23f8;
            uStack_1d70 = uStack_23f0;
            uStack_1d68 = uStack_23e8;
            auVar19._8_8_ = uStack_23f8;
            auVar19._0_8_ = local_2400;
            auVar19._16_8_ = uStack_23f0;
            auVar19._24_8_ = uStack_23e8;
            local_2860 = vpaddsb_avx2(auVar12,auVar19);
            local_2900[0] = auVar34._0_8_;
            local_f20 = local_2900[0];
            local_2900[1] = auVar34._8_8_;
            uStack_f18 = local_2900[1];
            local_2900[2] = auVar34._16_8_;
            uStack_f10 = local_2900[2];
            local_2680 = auVar38._0_8_;
            local_f40 = local_2680;
            lStack_2678 = auVar38._8_8_;
            uStack_f38 = lStack_2678;
            lStack_2670 = auVar38._16_8_;
            uStack_f30 = lStack_2670;
            auVar12 = vpmaxsb_avx2((undefined1  [32])*local_13e0,(undefined1  [32])*local_1400);
            local_2880._0_8_ = auVar12._0_8_;
            local_f60 = local_2880._0_8_;
            local_2880._8_8_ = auVar12._8_8_;
            uStack_f58 = local_2880._8_8_;
            local_2880._16_8_ = auVar12._16_8_;
            uStack_f50 = local_2880._16_8_;
            local_2880._24_8_ = auVar12._24_8_;
            uStack_f48 = local_2880._24_8_;
            local_f80 = local_27c0._0_8_;
            uStack_f78 = local_27c0._8_8_;
            uStack_f70 = local_27c0._16_8_;
            uStack_f68 = local_27c0._24_8_;
            local_2880 = vpmaxsb_avx2(auVar12,local_27c0);
            local_21e0 = local_2880._0_8_;
            lStack_21d8 = local_2880._8_8_;
            lStack_21d0 = local_2880._16_8_;
            lStack_21c8 = local_2880._24_8_;
            local_2200 = local_2900[0];
            uStack_21f8 = local_2900[1];
            uStack_21f0 = local_2900[2];
            auVar12 = vpcmpeqb_avx2(local_2880,(undefined1  [32])*local_13e0);
            local_2220 = local_2880._0_8_;
            lStack_2218 = local_2880._8_8_;
            lStack_2210 = local_2880._16_8_;
            lStack_2208 = local_2880._24_8_;
            local_2240 = local_27c0._0_8_;
            uStack_2238 = local_27c0._8_8_;
            uStack_2230 = local_27c0._16_8_;
            uStack_2228 = local_27c0._24_8_;
            auVar13 = vpcmpeqb_avx2(local_2880,local_27c0);
            local_26e0 = auVar39._0_8_;
            local_a00 = local_26e0;
            lStack_26d8 = auVar39._8_8_;
            uStack_9f8 = lStack_26d8;
            lStack_26d0 = auVar39._16_8_;
            uStack_9f0 = lStack_26d0;
            local_a20 = local_2820._0_8_;
            uStack_a18 = local_2820._8_8_;
            uStack_a10 = local_2820._16_8_;
            uStack_a08 = local_2820._24_8_;
            local_2a60 = auVar13._0_8_;
            local_a40 = local_2a60;
            uStack_2a58 = auVar13._8_8_;
            uStack_a38 = uStack_2a58;
            uStack_2a50 = auVar13._16_8_;
            uStack_a30 = uStack_2a50;
            uStack_2a48 = auVar13._24_8_;
            uStack_a28 = uStack_2a48;
            local_a60 = vpblendvb_avx2((undefined1  [32])*local_1408,local_2820,auVar13);
            local_2920[0] = auVar35._0_8_;
            local_a80 = local_2920[0];
            local_2920[1] = auVar35._8_8_;
            uStack_a78 = local_2920[1];
            local_2920[2] = auVar35._16_8_;
            uStack_a70 = local_2920[2];
            local_2a40 = auVar12._0_8_;
            local_aa0 = local_2a40;
            uStack_2a38 = auVar12._8_8_;
            uStack_a98 = uStack_2a38;
            uStack_2a30 = auVar12._16_8_;
            uStack_a90 = uStack_2a30;
            uStack_2a28 = auVar12._24_8_;
            uStack_a88 = uStack_2a28;
            local_28a0 = vpblendvb_avx2(local_a60,(undefined1  [32])*local_13e8,auVar12);
            local_2700 = auVar40._0_8_;
            local_ac0 = local_2700;
            lStack_26f8 = auVar40._8_8_;
            uStack_ab8 = lStack_26f8;
            lStack_26f0 = auVar40._16_8_;
            uStack_ab0 = lStack_26f0;
            local_ae0 = local_2840._0_8_;
            uStack_ad8 = local_2840._8_8_;
            uStack_ad0 = local_2840._16_8_;
            uStack_ac8 = local_2840._24_8_;
            local_b00 = local_2a60;
            uStack_af8 = uStack_2a58;
            uStack_af0 = uStack_2a50;
            uStack_ae8 = uStack_2a48;
            local_b20 = vpblendvb_avx2((undefined1  [32])*local_1410,local_2840,auVar13);
            local_2940[0] = auVar36._0_8_;
            local_b40 = local_2940[0];
            local_2940[1] = auVar36._8_8_;
            uStack_b38 = local_2940[1];
            local_2940[2] = auVar36._16_8_;
            uStack_b30 = local_2940[2];
            local_b60 = local_2a40;
            uStack_b58 = uStack_2a38;
            uStack_b50 = uStack_2a30;
            uStack_b48 = uStack_2a28;
            local_28c0 = vpblendvb_avx2(local_b20,(undefined1  [32])*local_13f0,auVar12);
            local_2720 = auVar41._0_8_;
            local_b80 = local_2720;
            lStack_2718 = auVar41._8_8_;
            uStack_b78 = lStack_2718;
            lStack_2710 = auVar41._16_8_;
            uStack_b70 = lStack_2710;
            local_ba0 = local_2860._0_8_;
            uStack_b98 = local_2860._8_8_;
            uStack_b90 = local_2860._16_8_;
            uStack_b88 = local_2860._24_8_;
            local_bc0 = local_2a60;
            uStack_bb8 = uStack_2a58;
            uStack_bb0 = uStack_2a50;
            uStack_ba8 = uStack_2a48;
            local_be0 = vpblendvb_avx2((undefined1  [32])*local_1418,local_2860,auVar13);
            local_2960[0] = auVar37._0_8_;
            local_c00 = local_2960[0];
            local_2960[1] = auVar37._8_8_;
            uStack_bf8 = local_2960[1];
            local_2960[2] = auVar37._16_8_;
            uStack_bf0 = local_2960[2];
            local_c20 = local_2a40;
            uStack_c18 = uStack_2a38;
            uStack_c10 = uStack_2a30;
            uStack_c08 = uStack_2a28;
            local_28e0 = vpblendvb_avx2(local_be0,(undefined1  [32])*local_13f8,auVar12);
            local_1708 = local_2308 + (int)local_229c;
            local_1740 = local_2880._0_8_;
            lStack_1738 = local_2880._8_8_;
            lStack_1730 = local_2880._16_8_;
            lStack_1728 = local_2880._24_8_;
            (*local_1708)[0] = local_2880._0_8_;
            (*local_1708)[1] = local_2880._8_8_;
            (*local_1708)[2] = local_2880._16_8_;
            (*local_1708)[3] = local_2880._24_8_;
            local_1748 = local_2310 + (int)local_229c;
            local_1780 = local_28a0._0_8_;
            lStack_1778 = local_28a0._8_8_;
            lStack_1770 = local_28a0._16_8_;
            lStack_1768 = local_28a0._24_8_;
            (*local_1748)[0] = local_28a0._0_8_;
            (*local_1748)[1] = local_28a0._8_8_;
            (*local_1748)[2] = local_28a0._16_8_;
            (*local_1748)[3] = local_28a0._24_8_;
            local_1788 = local_2318 + (int)local_229c;
            local_17c0 = local_28c0._0_8_;
            lStack_17b8 = local_28c0._8_8_;
            lStack_17b0 = local_28c0._16_8_;
            lStack_17a8 = local_28c0._24_8_;
            (*local_1788)[0] = local_28c0._0_8_;
            (*local_1788)[1] = local_28c0._8_8_;
            (*local_1788)[2] = local_28c0._16_8_;
            (*local_1788)[3] = local_28c0._24_8_;
            local_17c8 = local_2320 + (int)local_229c;
            local_1800 = local_28e0._0_8_;
            lStack_17f8 = local_28e0._8_8_;
            lStack_17f0 = local_28e0._16_8_;
            lStack_17e8 = local_28e0._24_8_;
            (*local_17c8)[0] = local_28e0._0_8_;
            (*local_17c8)[1] = local_28e0._8_8_;
            (*local_17c8)[2] = local_28e0._16_8_;
            (*local_17c8)[3] = local_28e0._24_8_;
            local_e0 = local_2480._0_8_;
            uStack_d8 = local_2480._8_8_;
            uStack_d0 = local_2480._16_8_;
            uStack_c8 = local_2480._24_8_;
            local_100 = local_2880._0_8_;
            lStack_f8 = local_2880._8_8_;
            lStack_f0 = local_2880._16_8_;
            lStack_e8 = local_2880._24_8_;
            local_2480 = vpminsb_avx2(local_2480,local_2880);
            local_fa0 = local_24a0._0_8_;
            uStack_f98 = local_24a0._8_8_;
            uStack_f90 = local_24a0._16_8_;
            uStack_f88 = local_24a0._24_8_;
            local_fc0 = local_2880._0_8_;
            lStack_fb8 = local_2880._8_8_;
            lStack_fb0 = local_2880._16_8_;
            lStack_fa8 = local_2880._24_8_;
            auVar12 = vpmaxsb_avx2(local_24a0,local_2880);
            local_24a0._0_8_ = auVar12._0_8_;
            local_fe0 = local_24a0._0_8_;
            local_24a0._8_8_ = auVar12._8_8_;
            uStack_fd8 = local_24a0._8_8_;
            local_24a0._16_8_ = auVar12._16_8_;
            uStack_fd0 = local_24a0._16_8_;
            local_24a0._24_8_ = auVar12._24_8_;
            uStack_fc8 = local_24a0._24_8_;
            local_1000 = local_28a0._0_8_;
            lStack_ff8 = local_28a0._8_8_;
            lStack_ff0 = local_28a0._16_8_;
            lStack_fe8 = local_28a0._24_8_;
            auVar12 = vpmaxsb_avx2(auVar12,local_28a0);
            local_24a0._0_8_ = auVar12._0_8_;
            local_1020 = local_24a0._0_8_;
            local_24a0._8_8_ = auVar12._8_8_;
            uStack_1018 = local_24a0._8_8_;
            local_24a0._16_8_ = auVar12._16_8_;
            uStack_1010 = local_24a0._16_8_;
            local_24a0._24_8_ = auVar12._24_8_;
            uStack_1008 = local_24a0._24_8_;
            local_1040 = local_28c0._0_8_;
            lStack_1038 = local_28c0._8_8_;
            lStack_1030 = local_28c0._16_8_;
            lStack_1028 = local_28c0._24_8_;
            auVar12 = vpmaxsb_avx2(auVar12,local_28c0);
            local_24a0._0_8_ = auVar12._0_8_;
            local_1060 = local_24a0._0_8_;
            local_24a0._8_8_ = auVar12._8_8_;
            uStack_1058 = local_24a0._8_8_;
            local_24a0._16_8_ = auVar12._16_8_;
            uStack_1050 = local_24a0._16_8_;
            local_24a0._24_8_ = auVar12._24_8_;
            uStack_1048 = local_24a0._24_8_;
            local_1080 = local_28e0._0_8_;
            lStack_1078 = local_28e0._8_8_;
            lStack_1070 = local_28e0._16_8_;
            lStack_1068 = local_28e0._24_8_;
            local_24a0 = vpmaxsb_avx2(auVar12,local_28e0);
            local_229c = local_229c + 1;
            lStack_f08 = lStack_21e8;
            local_19c0 = local_23a0;
          }
          local_1420 = local_2308 + local_22c4;
          auVar34 = *(undefined1 (*) [24])*local_1420;
          lStack_1288 = (*local_1420)[3];
          local_1428 = local_2310 + local_22c4;
          auVar35 = *(undefined1 (*) [24])*local_1428;
          lStack_c48 = (*local_1428)[3];
          local_1430 = local_2318 + local_22c4;
          auVar36 = *(undefined1 (*) [24])*local_1430;
          lStack_ca8 = (*local_1430)[3];
          local_1438 = local_2320 + local_22c4;
          auVar37 = *(undefined1 (*) [24])*local_1438;
          lStack_d08 = (*local_1438)[3];
          local_2880._0_8_ = auVar34._0_8_;
          local_12a0 = local_2880._0_8_;
          local_2880._8_8_ = auVar34._8_8_;
          uStack_1298 = local_2880._8_8_;
          local_2880._16_8_ = auVar34._16_8_;
          uStack_1290 = local_2880._16_8_;
          local_12c0 = local_24c0._0_8_;
          uStack_12b8 = local_24c0._8_8_;
          uStack_12b0 = local_24c0._16_8_;
          uStack_12a8 = local_24c0._24_8_;
          auVar12 = vpcmpgtb_avx2((undefined1  [32])*local_1420,local_24c0);
          local_10a0 = local_24c0._0_8_;
          uStack_1098 = local_24c0._8_8_;
          uStack_1090 = local_24c0._16_8_;
          uStack_1088 = local_24c0._24_8_;
          local_10c0 = local_2880._0_8_;
          uStack_10b8 = local_2880._8_8_;
          uStack_10b0 = local_2880._16_8_;
          local_24c0 = vpmaxsb_avx2(local_24c0,(undefined1  [32])*local_1420);
          local_c40 = local_24e0._0_8_;
          uStack_c38 = local_24e0._8_8_;
          uStack_c30 = local_24e0._16_8_;
          uStack_c28 = local_24e0._24_8_;
          local_28a0._0_8_ = auVar35._0_8_;
          local_c60 = local_28a0._0_8_;
          local_28a0._8_8_ = auVar35._8_8_;
          uStack_c58 = local_28a0._8_8_;
          local_28a0._16_8_ = auVar35._16_8_;
          uStack_c50 = local_28a0._16_8_;
          local_2b40 = auVar12._0_8_;
          local_c80 = local_2b40;
          uStack_2b38 = auVar12._8_8_;
          uStack_c78 = uStack_2b38;
          uStack_2b30 = auVar12._16_8_;
          uStack_c70 = uStack_2b30;
          uStack_2b28 = auVar12._24_8_;
          uStack_c68 = uStack_2b28;
          local_24e0 = vpblendvb_avx2(local_24e0,(undefined1  [32])*local_1428,auVar12);
          local_ca0 = local_2500._0_8_;
          uStack_c98 = local_2500._8_8_;
          uStack_c90 = local_2500._16_8_;
          uStack_c88 = local_2500._24_8_;
          local_28c0._0_8_ = auVar36._0_8_;
          local_cc0 = local_28c0._0_8_;
          local_28c0._8_8_ = auVar36._8_8_;
          uStack_cb8 = local_28c0._8_8_;
          local_28c0._16_8_ = auVar36._16_8_;
          uStack_cb0 = local_28c0._16_8_;
          local_ce0 = local_2b40;
          uStack_cd8 = uStack_2b38;
          uStack_cd0 = uStack_2b30;
          uStack_cc8 = uStack_2b28;
          local_2500 = vpblendvb_avx2(local_2500,(undefined1  [32])*local_1430,auVar12);
          local_d00 = local_2520._0_8_;
          uStack_cf8 = local_2520._8_8_;
          uStack_cf0 = local_2520._16_8_;
          uStack_ce8 = local_2520._24_8_;
          local_28e0._0_8_ = auVar37._0_8_;
          local_d20 = local_28e0._0_8_;
          local_28e0._8_8_ = auVar37._8_8_;
          uStack_d18 = local_28e0._8_8_;
          local_28e0._16_8_ = auVar37._16_8_;
          uStack_d10 = local_28e0._16_8_;
          local_d40 = local_2b40;
          uStack_d38 = uStack_2b38;
          uStack_d30 = uStack_2b30;
          uStack_d28 = uStack_2b28;
          local_2520 = vpblendvb_avx2(local_2520,(undefined1  [32])*local_1438,auVar12);
          local_60 = local_2540;
          local_80 = local_2b40;
          uStack_78 = uStack_2b38;
          uStack_70 = uStack_2b30;
          uStack_68 = uStack_2b28;
          local_a0 = vpand_avx2(local_2540,auVar12);
          if ((((((((((((((((((((((((((((((((local_a0 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (local_a0 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (local_a0 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (local_a0 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_a0 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_a0 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_a0 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_a0 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_a0 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_a0 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_a0 >> 0x57 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_a0 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_a0 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_a0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || SUB321(local_a0 >> 0x7f,0) != '\0') ||
                            (local_a0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (local_a0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_a0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_a0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_a0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_a0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_a0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_a0 >> 0xbf,0) != '\0') ||
                    (local_a0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_a0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_a0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_a0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_a0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_a0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              local_a0[0x1f] < '\0') {
            local_22b0 = local_22a0;
          }
          auVar9 = local_2540;
          lStack_10a8 = lStack_1288;
        }
        if (s2_beg != 0) {
          for (local_22a4 = 0; local_22a4 < (int)local_22c8; local_22a4 = local_22a4 + 1) {
            auVar12 = vperm2i128_avx2(auVar48._0_32_,local_24c0,0x28);
            local_24c0 = vpalignr_avx2(local_24c0,auVar12,0xf);
            auVar12 = vperm2i128_avx2(auVar12,local_24e0,0x28);
            local_24e0 = vpalignr_avx2(local_24e0,auVar12,0xf);
            auVar12 = vperm2i128_avx2(auVar12,local_2500,0x28);
            local_2500 = vpalignr_avx2(local_2500,auVar12,0xf);
            auVar12 = vperm2i128_avx2(auVar12,local_2520,0x28);
            auVar48 = ZEXT3264(auVar12);
            local_2520 = vpalignr_avx2(local_2520,auVar12,0xf);
          }
          local_22ac = local_22a8 + -1;
          local_2401 = local_24c0[0x17];
          local_2402 = local_24e0[0x17];
          local_2403 = local_2500[0x17];
          local_2404 = local_2520[0x17];
        }
        if (in_stack_00000008 != 0) {
          local_2b48 = local_2308;
          local_2b50 = local_2310;
          local_2b58 = local_2318;
          local_2b60 = local_2320;
          for (local_229c = 0; (int)local_229c < (int)(local_22c0 * local_22bc);
              local_229c = local_229c + 1) {
            iVar49 = (int)local_229c / local_22bc + ((int)local_229c % local_22bc) * local_22c0;
            if (iVar49 < local_22a8) {
              if ((char)local_2401 < (char)(*local_2b48)[0]) {
                local_2401 = (byte)(*local_2b48)[0];
                local_22b0 = local_228c + -1;
                local_2402 = (char)(*local_2b50)[0];
                local_2403 = (char)(*local_2b58)[0];
                local_2404 = (char)(*local_2b60)[0];
                local_22ac = iVar49;
              }
              else if ((((byte)(*local_2b48)[0] == local_2401) && (local_22b0 == local_228c + -1))
                      && (iVar49 < local_22ac)) {
                local_2402 = (char)(*local_2b50)[0];
                local_2403 = (char)(*local_2b58)[0];
                local_2404 = (char)(*local_2b60)[0];
                local_22ac = iVar49;
              }
            }
            local_2b48 = (__m256i *)((long)*local_2b48 + 1);
            local_2b50 = (__m256i *)((long)*local_2b50 + 1);
            local_2b58 = (__m256i *)((long)*local_2b58 + 1);
            local_2b60 = (__m256i *)((long)*local_2b60 + 1);
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_1440 = local_2308 + local_22c4;
          local_2ba0._0_32_ = *(undefined1 (*) [32])local_1440;
          local_1448 = local_2310 + local_22c4;
          local_2bc0 = *(undefined1 (*) [32])local_1448;
          local_1450 = local_2318 + local_22c4;
          local_2be0 = *(undefined1 (*) [32])local_1450;
          local_1458 = local_2320 + local_22c4;
          _local_2c00 = *local_1458;
          for (local_22a4 = 0; local_22a4 < (int)local_22c8; local_22a4 = local_22a4 + 1) {
            auVar12 = vperm2i128_avx2(auVar48._0_32_,local_2ba0._0_32_,0x28);
            local_2ba0._0_32_ = vpalignr_avx2(local_2ba0._0_32_,auVar12,0xf);
            auVar12 = vperm2i128_avx2(auVar12,local_2bc0,0x28);
            local_2bc0 = vpalignr_avx2(local_2bc0,auVar12,0xf);
            auVar12 = vperm2i128_avx2(auVar12,local_2be0,0x28);
            local_2be0 = vpalignr_avx2(local_2be0,auVar12,0xf);
            auVar12 = vperm2i128_avx2(auVar12,(undefined1  [32])_local_2c00,0x28);
            auVar48 = ZEXT3264(auVar12);
            _local_2c00 = (__m256i)vpalignr_avx2((undefined1  [32])_local_2c00,auVar12,0xf);
          }
          local_22b0 = local_228c + -1;
          local_22ac = local_22a8 + -1;
          local_2401 = local_2ba0[0x17];
          local_2402 = local_2bc0[0x17];
          local_2403 = local_2be0[0x17];
        }
        local_12e0 = local_2440;
        uStack_12d8 = uStack_2438;
        uStack_12d0 = uStack_2430;
        uStack_12c8 = uStack_2428;
        local_1300 = local_2480._0_8_;
        uStack_12f8 = local_2480._8_8_;
        uStack_12f0 = local_2480._16_8_;
        uStack_12e8 = local_2480._24_8_;
        auVar31._8_8_ = uStack_2438;
        auVar31._0_8_ = local_2440;
        auVar31._16_8_ = uStack_2430;
        auVar31._24_8_ = uStack_2428;
        local_1e0 = vpcmpgtb_avx2(auVar31,local_2480);
        local_1320 = local_24a0._0_8_;
        uStack_1318 = local_24a0._8_8_;
        uStack_1310 = local_24a0._16_8_;
        uStack_1308 = local_24a0._24_8_;
        local_1340 = local_2460;
        uStack_1338 = uStack_2458;
        uStack_1330 = uStack_2450;
        uStack_1328 = uStack_2448;
        auVar30._8_8_ = uStack_2458;
        auVar30._0_8_ = local_2460;
        auVar30._16_8_ = uStack_2450;
        auVar30._24_8_ = uStack_2448;
        local_200 = vpcmpgtb_avx2(local_24a0,auVar30);
        local_c0 = vpor_avx2(local_1e0,local_200);
        if ((((((((((((((((((((((((((((((((local_c0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_c0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_c0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_c0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_c0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_c0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_c0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_c0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_c0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_c0 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_c0 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_c0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_c0 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_c0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_c0 >> 0x7f,0) != '\0') ||
                          (local_c0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_c0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_c0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_c0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_c0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_c0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_c0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_c0 >> 0xbf,0) != '\0') ||
                  (local_c0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_c0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_c0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_c0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_c0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_c0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_c0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_c0[0x1f] < '\0') {
          local_25a8->flag = local_25a8->flag | 0x40;
          local_2401 = 0;
          local_2402 = '\0';
          local_2403 = '\0';
          local_2404 = '\0';
          local_22ac = 0;
          local_22b0 = 0;
        }
        local_25a8->score = (int)(char)local_2401;
        local_25a8->end_query = local_22ac;
        local_25a8->end_ref = local_22b0;
        *(int *)(local_25a8->field_4).extra = (int)local_2402;
        ((local_25a8->field_4).stats)->similar = (int)local_2403;
        ((local_25a8->field_4).stats)->length = (int)local_2404;
        parasail_free(local_2358);
        parasail_free(local_2350);
        parasail_free(local_2348);
        parasail_free(local_2340);
        parasail_free(local_2338);
        parasail_free(local_2330);
        parasail_free(local_2328);
        parasail_free(local_2320);
        parasail_free(local_2318);
        parasail_free(local_2310);
        parasail_free(local_2308);
        parasail_free(local_2300);
        parasail_free(local_22f8);
        parasail_free(local_22f0);
        parasail_free(local_22e8);
        local_2278 = local_25a8;
      }
    }
  }
  return local_2278;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile8.score;
    pvPm = (__m256i*)profile->profile8.matches;
    pvPs = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi8(segLen), 1);
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
            vGapperL = _mm256_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHpM = _mm256_slli_si256_rpl(vHpM, 1);
        vHpS = _mm256_slli_si256_rpl(vHpS, 1);
        vHpL = _mm256_slli_si256_rpl(vHpL, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi8(vH, vGapO);
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            case1 = _mm256_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm256_max_epi8(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi8(vEL, vOne);
            vGapper = _mm256_adds_epi8(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vF, vGapper),
                    _mm256_cmpeq_epi8(vF, vGapper));
            vF = _mm256_max_epi8(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi8(vHp, vW);
            vHpM = _mm256_adds_epi8(vHpM, vWM);
            vHpS = _mm256_adds_epi8(vHpS, vWS);
            vHpL = _mm256_adds_epi8(vHpL, vOne);
            case1 = _mm256_cmpgt_epi8(vE, vHp);
            vHt = _mm256_max_epi8(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHtM = _mm256_slli_si256_rpl(vHtM, 1);
        vHtS = _mm256_slli_si256_rpl(vHtS, 1);
        vHtL = _mm256_slli_si256_rpl(vHtL, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi8(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi8(vGapper, vF),
                _mm256_cmpeq_epi8(vGapper, vF));
        vF = _mm256_max_epi8(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 1);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 1);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vFt, vF),
                    _mm256_cmpeq_epi8(vFt, vF));
            vF = _mm256_max_epi8(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vFM = _mm256_slli_si256_rpl(vFM, 1);
        vFS = _mm256_slli_si256_rpl(vFS, 1);
        vFL = _mm256_slli_si256_rpl(vFL, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi8(vF, vHt);
        vH = _mm256_max_epi8(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi8(vH, vGapO);
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi8(vFL, vOne);
            vH = _mm256_max_epi8(vHp, vE);
            vH = _mm256_max_epi8(vH, vF);
            case1 = _mm256_cmpeq_epi8(vH, vHp);
            case2 = _mm256_cmpeq_epi8(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm256_max_epi8(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 1);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 1);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl(vMaxM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl(vMaxS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl(vMaxL, 31);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int8_t *m = (int8_t*)pvHM;
        int8_t *s = (int8_t*)pvHS;
        int8_t *l = (int8_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
            vHM = _mm256_slli_si256_rpl(vHM, 1);
            vHS = _mm256_slli_si256_rpl(vHS, 1);
            vHL = _mm256_slli_si256_rpl(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}